

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  uint uVar45;
  ulong uVar46;
  long lVar47;
  byte bVar48;
  uint uVar49;
  uint uVar50;
  ulong uVar51;
  ulong uVar52;
  uint uVar53;
  float fVar54;
  undefined4 uVar55;
  float fVar56;
  float fVar57;
  float fVar80;
  float fVar81;
  vint4 bi_2;
  undefined1 auVar58 [16];
  float fVar82;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar83;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined8 uVar84;
  vint4 bi_1;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 extraout_var [56];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  vint4 ai_2;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  float fVar136;
  vint4 ai;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  vint4 bi;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  float fVar152;
  float fVar169;
  float fVar170;
  vfloat4 b0_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar171;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  float fVar172;
  float fVar185;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar176 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar186;
  undefined1 auVar184 [32];
  float fVar190;
  float fVar200;
  vint4 ai_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar201;
  float fVar216;
  vfloat4 a0_2;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar217;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  vfloat4 a0_3;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar238;
  float fVar250;
  float fVar251;
  vfloat4 a0_1;
  undefined1 auVar239 [16];
  float fVar252;
  undefined1 auVar240 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar241 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  vfloat4 a0;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar266 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar277 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_638 [8];
  float fStack_630;
  float fStack_62c;
  undefined1 local_608 [8];
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined1 local_548 [32];
  undefined1 local_528 [16];
  undefined1 (*local_510) [16];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 auStack_4f8 [16];
  undefined1 local_4e8 [32];
  RTCFilterFunctionNArguments local_4c8;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  uint auStack_3c8 [4];
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 auStack_3a8 [16];
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  undefined1 auVar276 [32];
  
  PVar2 = prim[1];
  uVar51 = (ulong)(byte)PVar2;
  fVar54 = *(float *)(prim + uVar51 * 0x19 + 0x12);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar124 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar124 = vinsertps_avx(auVar124,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar101 = vsubps_avx(auVar101,*(undefined1 (*) [16])(prim + uVar51 * 0x19 + 6));
  auVar58._0_4_ = fVar54 * auVar101._0_4_;
  auVar58._4_4_ = fVar54 * auVar101._4_4_;
  auVar58._8_4_ = fVar54 * auVar101._8_4_;
  auVar58._12_4_ = fVar54 * auVar101._12_4_;
  auVar137._0_4_ = fVar54 * auVar124._0_4_;
  auVar137._4_4_ = fVar54 * auVar124._4_4_;
  auVar137._8_4_ = fVar54 * auVar124._8_4_;
  auVar137._12_4_ = fVar54 * auVar124._12_4_;
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 4 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 5 + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 6 + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar51 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar46 = (ulong)(uint)((int)(uVar51 * 9) * 2);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 + uVar51 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  uVar46 = (ulong)(uint)((int)(uVar51 * 5) << 2);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar264._4_4_ = auVar137._0_4_;
  auVar264._0_4_ = auVar137._0_4_;
  auVar264._8_4_ = auVar137._0_4_;
  auVar264._12_4_ = auVar137._0_4_;
  auVar86 = vshufps_avx(auVar137,auVar137,0x55);
  auVar59 = vshufps_avx(auVar137,auVar137,0xaa);
  fVar54 = auVar59._0_4_;
  auVar232._0_4_ = fVar54 * auVar121._0_4_;
  fVar57 = auVar59._4_4_;
  auVar232._4_4_ = fVar57 * auVar121._4_4_;
  fVar81 = auVar59._8_4_;
  auVar232._8_4_ = fVar81 * auVar121._8_4_;
  fVar82 = auVar59._12_4_;
  auVar232._12_4_ = fVar82 * auVar121._12_4_;
  auVar218._0_4_ = auVar11._0_4_ * fVar54;
  auVar218._4_4_ = auVar11._4_4_ * fVar57;
  auVar218._8_4_ = auVar11._8_4_ * fVar81;
  auVar218._12_4_ = auVar11._12_4_ * fVar82;
  auVar191._0_4_ = auVar106._0_4_ * fVar54;
  auVar191._4_4_ = auVar106._4_4_ * fVar57;
  auVar191._8_4_ = auVar106._8_4_ * fVar81;
  auVar191._12_4_ = auVar106._12_4_ * fVar82;
  auVar59 = vfmadd231ps_fma(auVar232,auVar86,auVar124);
  auVar87 = vfmadd231ps_fma(auVar218,auVar86,auVar10);
  auVar86 = vfmadd231ps_fma(auVar191,auVar60,auVar86);
  auVar116 = vfmadd231ps_fma(auVar59,auVar264,auVar101);
  auVar87 = vfmadd231ps_fma(auVar87,auVar264,auVar9);
  auVar234 = vfmadd231ps_fma(auVar86,auVar61,auVar264);
  auVar265._4_4_ = auVar58._0_4_;
  auVar265._0_4_ = auVar58._0_4_;
  auVar265._8_4_ = auVar58._0_4_;
  auVar265._12_4_ = auVar58._0_4_;
  auVar86 = vshufps_avx(auVar58,auVar58,0x55);
  auVar59 = vshufps_avx(auVar58,auVar58,0xaa);
  fVar54 = auVar59._0_4_;
  auVar138._0_4_ = fVar54 * auVar121._0_4_;
  fVar57 = auVar59._4_4_;
  auVar138._4_4_ = fVar57 * auVar121._4_4_;
  fVar81 = auVar59._8_4_;
  auVar138._8_4_ = fVar81 * auVar121._8_4_;
  fVar82 = auVar59._12_4_;
  auVar138._12_4_ = fVar82 * auVar121._12_4_;
  auVar85._0_4_ = auVar11._0_4_ * fVar54;
  auVar85._4_4_ = auVar11._4_4_ * fVar57;
  auVar85._8_4_ = auVar11._8_4_ * fVar81;
  auVar85._12_4_ = auVar11._12_4_ * fVar82;
  auVar59._0_4_ = auVar106._0_4_ * fVar54;
  auVar59._4_4_ = auVar106._4_4_ * fVar57;
  auVar59._8_4_ = auVar106._8_4_ * fVar81;
  auVar59._12_4_ = auVar106._12_4_ * fVar82;
  auVar124 = vfmadd231ps_fma(auVar138,auVar86,auVar124);
  auVar121 = vfmadd231ps_fma(auVar85,auVar86,auVar10);
  auVar10 = vfmadd231ps_fma(auVar59,auVar86,auVar60);
  auVar11 = vfmadd231ps_fma(auVar124,auVar265,auVar101);
  auVar60 = vfmadd231ps_fma(auVar121,auVar265,auVar9);
  auVar106 = vfmadd231ps_fma(auVar10,auVar265,auVar61);
  local_408._8_4_ = 0x7fffffff;
  local_408._0_8_ = 0x7fffffff7fffffff;
  local_408._12_4_ = 0x7fffffff;
  auVar101 = vandps_avx(auVar116,local_408);
  auVar118._8_4_ = 0x219392ef;
  auVar118._0_8_ = 0x219392ef219392ef;
  auVar118._12_4_ = 0x219392ef;
  auVar101 = vcmpps_avx(auVar101,auVar118,1);
  auVar124 = vblendvps_avx(auVar116,auVar118,auVar101);
  auVar101 = vandps_avx(auVar87,local_408);
  auVar101 = vcmpps_avx(auVar101,auVar118,1);
  auVar121 = vblendvps_avx(auVar87,auVar118,auVar101);
  auVar101 = vandps_avx(auVar234,local_408);
  auVar101 = vcmpps_avx(auVar101,auVar118,1);
  auVar101 = vblendvps_avx(auVar234,auVar118,auVar101);
  auVar9 = vrcpps_avx(auVar124);
  auVar173._8_4_ = 0x3f800000;
  auVar173._0_8_ = 0x3f8000003f800000;
  auVar173._12_4_ = 0x3f800000;
  auVar124 = vfnmadd213ps_fma(auVar124,auVar9,auVar173);
  auVar9 = vfmadd132ps_fma(auVar124,auVar9,auVar9);
  auVar124 = vrcpps_avx(auVar121);
  auVar121 = vfnmadd213ps_fma(auVar121,auVar124,auVar173);
  auVar10 = vfmadd132ps_fma(auVar121,auVar124,auVar124);
  auVar124 = vrcpps_avx(auVar101);
  auVar101 = vfnmadd213ps_fma(auVar101,auVar124,auVar173);
  auVar61 = vfmadd132ps_fma(auVar101,auVar124,auVar124);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar51 * 7 + 6);
  auVar101 = vpmovsxwd_avx(auVar101);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar11);
  auVar234._0_4_ = auVar9._0_4_ * auVar101._0_4_;
  auVar234._4_4_ = auVar9._4_4_ * auVar101._4_4_;
  auVar234._8_4_ = auVar9._8_4_ * auVar101._8_4_;
  auVar234._12_4_ = auVar9._12_4_ * auVar101._12_4_;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar51 * 9 + 6);
  auVar101 = vpmovsxwd_avx(auVar124);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar11);
  auVar139._0_4_ = auVar9._0_4_ * auVar101._0_4_;
  auVar139._4_4_ = auVar9._4_4_ * auVar101._4_4_;
  auVar139._8_4_ = auVar9._8_4_ * auVar101._8_4_;
  auVar139._12_4_ = auVar9._12_4_ * auVar101._12_4_;
  auVar87._1_3_ = 0;
  auVar87[0] = PVar2;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar124 = vpmovsxwd_avx(auVar121);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar51 * -2 + 6);
  auVar101 = vpmovsxwd_avx(auVar9);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar60);
  auVar192._0_4_ = auVar101._0_4_ * auVar10._0_4_;
  auVar192._4_4_ = auVar101._4_4_ * auVar10._4_4_;
  auVar192._8_4_ = auVar101._8_4_ * auVar10._8_4_;
  auVar192._12_4_ = auVar101._12_4_ * auVar10._12_4_;
  auVar101 = vcvtdq2ps_avx(auVar124);
  auVar101 = vsubps_avx(auVar101,auVar60);
  auVar86._0_4_ = auVar10._0_4_ * auVar101._0_4_;
  auVar86._4_4_ = auVar10._4_4_ * auVar101._4_4_;
  auVar86._8_4_ = auVar10._8_4_ * auVar101._8_4_;
  auVar86._12_4_ = auVar10._12_4_ * auVar101._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar46 + uVar51 + 6);
  auVar101 = vpmovsxwd_avx(auVar10);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar106);
  auVar116._0_4_ = auVar61._0_4_ * auVar101._0_4_;
  auVar116._4_4_ = auVar61._4_4_ * auVar101._4_4_;
  auVar116._8_4_ = auVar61._8_4_ * auVar101._8_4_;
  auVar116._12_4_ = auVar61._12_4_ * auVar101._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar51 * 0x17 + 6);
  auVar101 = vpmovsxwd_avx(auVar11);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar106);
  auVar60._0_4_ = auVar61._0_4_ * auVar101._0_4_;
  auVar60._4_4_ = auVar61._4_4_ * auVar101._4_4_;
  auVar60._8_4_ = auVar61._8_4_ * auVar101._8_4_;
  auVar60._12_4_ = auVar61._12_4_ * auVar101._12_4_;
  auVar101 = vpminsd_avx(auVar234,auVar139);
  auVar124 = vpminsd_avx(auVar192,auVar86);
  auVar101 = vmaxps_avx(auVar101,auVar124);
  auVar124 = vpminsd_avx(auVar116,auVar60);
  uVar55 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar202._4_4_ = uVar55;
  auVar202._0_4_ = uVar55;
  auVar202._8_4_ = uVar55;
  auVar202._12_4_ = uVar55;
  auVar124 = vmaxps_avx(auVar124,auVar202);
  auVar101 = vmaxps_avx(auVar101,auVar124);
  local_378._0_4_ = auVar101._0_4_ * 0.99999964;
  local_378._4_4_ = auVar101._4_4_ * 0.99999964;
  local_378._8_4_ = auVar101._8_4_ * 0.99999964;
  local_378._12_4_ = auVar101._12_4_ * 0.99999964;
  auVar101 = vpmaxsd_avx(auVar234,auVar139);
  auVar124 = vpmaxsd_avx(auVar192,auVar86);
  auVar101 = vminps_avx(auVar101,auVar124);
  auVar124 = vpmaxsd_avx(auVar116,auVar60);
  uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar106._4_4_ = uVar55;
  auVar106._0_4_ = uVar55;
  auVar106._8_4_ = uVar55;
  auVar106._12_4_ = uVar55;
  auVar124 = vminps_avx(auVar124,auVar106);
  auVar101 = vminps_avx(auVar101,auVar124);
  auVar61._0_4_ = auVar101._0_4_ * 1.0000004;
  auVar61._4_4_ = auVar101._4_4_ * 1.0000004;
  auVar61._8_4_ = auVar101._8_4_ * 1.0000004;
  auVar61._12_4_ = auVar101._12_4_ * 1.0000004;
  auVar87[4] = PVar2;
  auVar87._5_3_ = 0;
  auVar87[8] = PVar2;
  auVar87._9_3_ = 0;
  auVar87[0xc] = PVar2;
  auVar87._13_3_ = 0;
  auVar124 = vpcmpgtd_avx(auVar87,_DAT_01f7fcf0);
  auVar101 = vcmpps_avx(local_378,auVar61,2);
  auVar101 = vandps_avx(auVar101,auVar124);
  uVar45 = vmovmskps_avx(auVar101);
  if (uVar45 == 0) {
    return;
  }
  uVar45 = uVar45 & 0xff;
  auVar77._16_16_ = mm_lookupmask_ps._240_16_;
  auVar77._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar77,ZEXT832(0) << 0x20,0x80);
  local_510 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  do {
    lVar47 = 0;
    uVar51 = (ulong)uVar45;
    for (uVar46 = uVar51; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
      lVar47 = lVar47 + 1;
    }
    uVar45 = *(uint *)(prim + 2);
    uVar3 = *(uint *)(prim + lVar47 * 4 + 6);
    pGVar4 = (context->scene->geometries).items[uVar45].ptr;
    uVar46 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                             pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)uVar3);
    p_Var5 = pGVar4[1].intersectionFilterN;
    pvVar6 = pGVar4[2].userPtr;
    _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar101 = *(undefined1 (*) [16])(_Var7 + uVar46 * (long)pvVar6);
    auVar124 = *(undefined1 (*) [16])(_Var7 + (uVar46 + 1) * (long)pvVar6);
    auVar121 = *(undefined1 (*) [16])(_Var7 + (uVar46 + 2) * (long)pvVar6);
    auVar9 = *(undefined1 (*) [16])(_Var7 + (long)pvVar6 * (uVar46 + 3));
    lVar47 = *(long *)&pGVar4[1].time_range.upper;
    auVar10 = *(undefined1 (*) [16])(lVar47 + (long)p_Var5 * uVar46);
    auVar11 = *(undefined1 (*) [16])(lVar47 + (long)p_Var5 * (uVar46 + 1));
    auVar61 = *(undefined1 (*) [16])(lVar47 + (long)p_Var5 * (uVar46 + 2));
    uVar51 = uVar51 - 1 & uVar51;
    auVar60 = *(undefined1 (*) [16])(lVar47 + (long)p_Var5 * (uVar46 + 3));
    if (uVar51 != 0) {
      uVar52 = uVar51 - 1 & uVar51;
      for (uVar46 = uVar51; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
      }
      if (uVar52 != 0) {
        for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar116 = ZEXT816(0) << 0x40;
    auVar88._0_4_ = auVar60._0_4_ * 0.0;
    auVar88._4_4_ = auVar60._4_4_ * 0.0;
    auVar88._8_4_ = auVar60._8_4_ * 0.0;
    auVar88._12_4_ = auVar60._12_4_ * 0.0;
    auVar59 = vfmadd231ps_fma(auVar88,auVar61,auVar116);
    auVar86 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar59);
    local_638._0_4_ = auVar10._0_4_ + auVar86._0_4_;
    local_638._4_4_ = auVar10._4_4_ + auVar86._4_4_;
    fStack_630 = auVar10._8_4_ + auVar86._8_4_;
    fStack_62c = auVar10._12_4_ + auVar86._12_4_;
    auVar266._8_4_ = 0x40400000;
    auVar266._0_8_ = 0x4040000040400000;
    auVar266._12_4_ = 0x40400000;
    auVar86 = vfmadd231ps_fma(auVar59,auVar11,auVar266);
    auVar87 = vfnmadd231ps_fma(auVar86,auVar10,auVar266);
    auVar239._0_4_ = auVar9._0_4_ * 0.0;
    auVar239._4_4_ = auVar9._4_4_ * 0.0;
    auVar239._8_4_ = auVar9._8_4_ * 0.0;
    auVar239._12_4_ = auVar9._12_4_ * 0.0;
    auVar59 = vfmadd231ps_fma(auVar239,auVar121,auVar116);
    auVar86 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar124,auVar59);
    auVar253._0_4_ = auVar101._0_4_ + auVar86._0_4_;
    auVar253._4_4_ = auVar101._4_4_ + auVar86._4_4_;
    auVar253._8_4_ = auVar101._8_4_ + auVar86._8_4_;
    auVar253._12_4_ = auVar101._12_4_ + auVar86._12_4_;
    auVar86 = vfmadd231ps_fma(auVar59,auVar124,auVar266);
    auVar59 = vfnmadd231ps_fma(auVar86,auVar101,auVar266);
    auVar86 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar61,auVar60);
    auVar86 = vfmadd231ps_fma(auVar86,auVar11,auVar116);
    auVar86 = vfmadd231ps_fma(auVar86,auVar10,auVar116);
    auVar128._0_4_ = auVar60._0_4_ * 3.0;
    auVar128._4_4_ = auVar60._4_4_ * 3.0;
    auVar128._8_4_ = auVar60._8_4_ * 3.0;
    auVar128._12_4_ = auVar60._12_4_ * 3.0;
    auVar61 = vfnmadd231ps_fma(auVar128,auVar266,auVar61);
    auVar11 = vfmadd231ps_fma(auVar61,auVar116,auVar11);
    auVar61 = vfnmadd231ps_fma(auVar11,auVar116,auVar10);
    auVar10 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar121,auVar9);
    auVar10 = vfmadd231ps_fma(auVar10,auVar124,auVar116);
    auVar10 = vfmadd231ps_fma(auVar10,auVar101,auVar116);
    auVar219._0_4_ = auVar9._0_4_ * 3.0;
    auVar219._4_4_ = auVar9._4_4_ * 3.0;
    auVar219._8_4_ = auVar9._8_4_ * 3.0;
    auVar219._12_4_ = auVar9._12_4_ * 3.0;
    auVar121 = vfnmadd231ps_fma(auVar219,auVar266,auVar121);
    auVar124 = vfmadd231ps_fma(auVar121,auVar116,auVar124);
    auVar11 = vfnmadd231ps_fma(auVar124,auVar116,auVar101);
    auVar101 = vshufps_avx(auVar87,auVar87,0xc9);
    auVar124 = vshufps_avx(auVar253,auVar253,0xc9);
    fVar115 = auVar87._0_4_;
    auVar153._0_4_ = fVar115 * auVar124._0_4_;
    fVar80 = auVar87._4_4_;
    auVar153._4_4_ = fVar80 * auVar124._4_4_;
    fVar56 = auVar87._8_4_;
    auVar153._8_4_ = fVar56 * auVar124._8_4_;
    fVar83 = auVar87._12_4_;
    auVar153._12_4_ = fVar83 * auVar124._12_4_;
    auVar124 = vfmsub231ps_fma(auVar153,auVar101,auVar253);
    auVar121 = vshufps_avx(auVar124,auVar124,0xc9);
    auVar124 = vshufps_avx(auVar59,auVar59,0xc9);
    auVar154._0_4_ = fVar115 * auVar124._0_4_;
    auVar154._4_4_ = fVar80 * auVar124._4_4_;
    auVar154._8_4_ = fVar56 * auVar124._8_4_;
    auVar154._12_4_ = fVar83 * auVar124._12_4_;
    auVar101 = vfmsub231ps_fma(auVar154,auVar101,auVar59);
    auVar9 = vshufps_avx(auVar101,auVar101,0xc9);
    auVar101 = vshufps_avx(auVar61,auVar61,0xc9);
    auVar124 = vshufps_avx(auVar10,auVar10,0xc9);
    fVar172 = auVar61._0_4_;
    auVar140._0_4_ = fVar172 * auVar124._0_4_;
    fVar217 = auVar61._4_4_;
    auVar140._4_4_ = fVar217 * auVar124._4_4_;
    fVar127 = auVar61._8_4_;
    auVar140._8_4_ = fVar127 * auVar124._8_4_;
    fVar136 = auVar61._12_4_;
    auVar140._12_4_ = fVar136 * auVar124._12_4_;
    auVar124 = vfmsub231ps_fma(auVar140,auVar101,auVar10);
    auVar10 = vshufps_avx(auVar124,auVar124,0xc9);
    auVar124 = vshufps_avx(auVar11,auVar11,0xc9);
    auVar174._0_4_ = fVar172 * auVar124._0_4_;
    auVar174._4_4_ = fVar217 * auVar124._4_4_;
    auVar174._8_4_ = fVar127 * auVar124._8_4_;
    auVar174._12_4_ = fVar136 * auVar124._12_4_;
    auVar124 = vfmsub231ps_fma(auVar174,auVar101,auVar11);
    auVar101 = vdpps_avx(auVar121,auVar121,0x7f);
    auVar11 = vshufps_avx(auVar124,auVar124,0xc9);
    fVar57 = auVar101._0_4_;
    auVar220._4_12_ = ZEXT812(0) << 0x20;
    auVar220._0_4_ = fVar57;
    auVar124 = vrsqrtss_avx(auVar220,auVar220);
    fVar54 = auVar124._0_4_;
    auVar124 = vdpps_avx(auVar121,auVar9,0x7f);
    fVar81 = fVar54 * 1.5 - fVar57 * 0.5 * fVar54 * fVar54 * fVar54;
    fVar152 = auVar121._0_4_ * fVar81;
    fVar169 = auVar121._4_4_ * fVar81;
    fVar170 = auVar121._8_4_ * fVar81;
    fVar171 = auVar121._12_4_ * fVar81;
    auVar233._0_4_ = auVar9._0_4_ * fVar57;
    auVar233._4_4_ = auVar9._4_4_ * fVar57;
    auVar233._8_4_ = auVar9._8_4_ * fVar57;
    auVar233._12_4_ = auVar9._12_4_ * fVar57;
    fVar54 = auVar124._0_4_;
    auVar193._0_4_ = auVar121._0_4_ * fVar54;
    auVar193._4_4_ = auVar121._4_4_ * fVar54;
    auVar193._8_4_ = auVar121._8_4_ * fVar54;
    auVar193._12_4_ = auVar121._12_4_ * fVar54;
    auVar121 = vsubps_avx(auVar233,auVar193);
    auVar124 = vrcpss_avx(auVar220,auVar220);
    auVar101 = vfnmadd213ss_fma(auVar101,auVar124,SUB6416(ZEXT464(0x40000000),0));
    fVar54 = auVar124._0_4_ * auVar101._0_4_;
    auVar101 = vdpps_avx(auVar10,auVar10,0x7f);
    fVar57 = auVar101._0_4_;
    auVar203._4_12_ = ZEXT812(0) << 0x20;
    auVar203._0_4_ = fVar57;
    auVar124 = vrsqrtss_avx(auVar203,auVar203);
    fVar82 = auVar124._0_4_;
    fVar82 = fVar82 * 1.5 - fVar57 * 0.5 * fVar82 * fVar82 * fVar82;
    fVar238 = fVar82 * auVar10._0_4_;
    fVar250 = fVar82 * auVar10._4_4_;
    fVar251 = fVar82 * auVar10._8_4_;
    fVar252 = fVar82 * auVar10._12_4_;
    auVar124 = vdpps_avx(auVar10,auVar11,0x7f);
    auVar175._0_4_ = fVar57 * auVar11._0_4_;
    auVar175._4_4_ = fVar57 * auVar11._4_4_;
    auVar175._8_4_ = fVar57 * auVar11._8_4_;
    auVar175._12_4_ = fVar57 * auVar11._12_4_;
    fVar57 = auVar124._0_4_;
    auVar141._0_4_ = fVar57 * auVar10._0_4_;
    auVar141._4_4_ = fVar57 * auVar10._4_4_;
    auVar141._8_4_ = fVar57 * auVar10._8_4_;
    auVar141._12_4_ = fVar57 * auVar10._12_4_;
    auVar9 = vsubps_avx(auVar175,auVar141);
    auVar124 = vrcpss_avx(auVar203,auVar203);
    auVar101 = vfnmadd213ss_fma(auVar101,auVar124,SUB6416(ZEXT464(0x40000000),0));
    fVar57 = auVar101._0_4_ * auVar124._0_4_;
    auVar101 = vshufps_avx(_local_638,_local_638,0xff);
    auVar204._0_4_ = auVar101._0_4_ * fVar152;
    auVar204._4_4_ = auVar101._4_4_ * fVar169;
    auVar204._8_4_ = auVar101._8_4_ * fVar170;
    auVar204._12_4_ = auVar101._12_4_ * fVar171;
    local_438 = vsubps_avx(_local_638,auVar204);
    auVar124 = vshufps_avx(auVar87,auVar87,0xff);
    auVar155._0_4_ = auVar124._0_4_ * fVar152 + fVar81 * auVar121._0_4_ * fVar54 * auVar101._0_4_;
    auVar155._4_4_ = auVar124._4_4_ * fVar169 + fVar81 * auVar121._4_4_ * fVar54 * auVar101._4_4_;
    auVar155._8_4_ = auVar124._8_4_ * fVar170 + fVar81 * auVar121._8_4_ * fVar54 * auVar101._8_4_;
    auVar155._12_4_ =
         auVar124._12_4_ * fVar171 + fVar81 * auVar121._12_4_ * fVar54 * auVar101._12_4_;
    auVar121 = vsubps_avx(auVar87,auVar155);
    local_448._0_4_ = auVar204._0_4_ + (float)local_638._0_4_;
    local_448._4_4_ = auVar204._4_4_ + (float)local_638._4_4_;
    fStack_440 = auVar204._8_4_ + fStack_630;
    fStack_43c = auVar204._12_4_ + fStack_62c;
    auVar101 = vshufps_avx(auVar86,auVar86,0xff);
    auVar107._0_4_ = fVar238 * auVar101._0_4_;
    auVar107._4_4_ = fVar250 * auVar101._4_4_;
    auVar107._8_4_ = fVar251 * auVar101._8_4_;
    auVar107._12_4_ = fVar252 * auVar101._12_4_;
    local_458 = vsubps_avx(auVar86,auVar107);
    auVar124 = vshufps_avx(auVar61,auVar61,0xff);
    auVar89._0_4_ = fVar238 * auVar124._0_4_ + auVar101._0_4_ * fVar82 * auVar9._0_4_ * fVar57;
    auVar89._4_4_ = fVar250 * auVar124._4_4_ + auVar101._4_4_ * fVar82 * auVar9._4_4_ * fVar57;
    auVar89._8_4_ = fVar251 * auVar124._8_4_ + auVar101._8_4_ * fVar82 * auVar9._8_4_ * fVar57;
    auVar89._12_4_ = fVar252 * auVar124._12_4_ + auVar101._12_4_ * fVar82 * auVar9._12_4_ * fVar57;
    auVar101 = vsubps_avx(auVar61,auVar89);
    fVar152 = auVar86._0_4_ + auVar107._0_4_;
    fVar169 = auVar86._4_4_ + auVar107._4_4_;
    fVar170 = auVar86._8_4_ + auVar107._8_4_;
    fVar171 = auVar86._12_4_ + auVar107._12_4_;
    local_468._0_4_ = local_438._0_4_ + auVar121._0_4_ * 0.33333334;
    local_468._4_4_ = local_438._4_4_ + auVar121._4_4_ * 0.33333334;
    local_468._8_4_ = local_438._8_4_ + auVar121._8_4_ * 0.33333334;
    local_468._12_4_ = local_438._12_4_ + auVar121._12_4_ * 0.33333334;
    auVar90._0_4_ = auVar101._0_4_ * 0.33333334;
    auVar90._4_4_ = auVar101._4_4_ * 0.33333334;
    auVar90._8_4_ = auVar101._8_4_ * 0.33333334;
    auVar90._12_4_ = auVar101._12_4_ * 0.33333334;
    local_478 = vsubps_avx(local_458,auVar90);
    local_418 = vsubps_avx(local_438,auVar106);
    auVar101 = vshufps_avx(local_418,local_418,0x55);
    auVar124 = vshufps_avx(local_418,local_418,0xaa);
    aVar1 = pre->ray_space[k].vy.field_0;
    fVar54 = pre->ray_space[k].vz.field_0.m128[0];
    fVar57 = pre->ray_space[k].vz.field_0.m128[1];
    fVar81 = pre->ray_space[k].vz.field_0.m128[2];
    fVar82 = pre->ray_space[k].vz.field_0.m128[3];
    auVar91._0_4_ = fVar54 * auVar124._0_4_;
    auVar91._4_4_ = fVar57 * auVar124._4_4_;
    auVar91._8_4_ = fVar81 * auVar124._8_4_;
    auVar91._12_4_ = fVar82 * auVar124._12_4_;
    auVar121 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar1,auVar101);
    local_428 = vsubps_avx(local_468,auVar106);
    auVar101 = vshufps_avx(local_428,local_428,0x55);
    auVar124 = vshufps_avx(local_428,local_428,0xaa);
    auVar272._0_4_ = fVar54 * auVar124._0_4_;
    auVar272._4_4_ = fVar57 * auVar124._4_4_;
    auVar272._8_4_ = fVar81 * auVar124._8_4_;
    auVar272._12_4_ = fVar82 * auVar124._12_4_;
    auVar124 = vfmadd231ps_fma(auVar272,(undefined1  [16])aVar1,auVar101);
    local_2c8 = vsubps_avx(local_478,auVar106);
    auVar101 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar240._0_4_ = fVar54 * auVar101._0_4_;
    auVar240._4_4_ = fVar57 * auVar101._4_4_;
    auVar240._8_4_ = fVar81 * auVar101._8_4_;
    auVar240._12_4_ = fVar82 * auVar101._12_4_;
    auVar101 = vshufps_avx(local_2c8,local_2c8,0x55);
    auVar9 = vfmadd231ps_fma(auVar240,(undefined1  [16])aVar1,auVar101);
    local_2d8 = vsubps_avx(local_458,auVar106);
    auVar101 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar254._0_4_ = fVar54 * auVar101._0_4_;
    auVar254._4_4_ = fVar57 * auVar101._4_4_;
    auVar254._8_4_ = fVar81 * auVar101._8_4_;
    auVar254._12_4_ = fVar82 * auVar101._12_4_;
    auVar101 = vshufps_avx(local_2d8,local_2d8,0x55);
    auVar10 = vfmadd231ps_fma(auVar254,(undefined1  [16])aVar1,auVar101);
    local_2e8 = vsubps_avx(_local_448,auVar106);
    auVar101 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar142._0_4_ = fVar54 * auVar101._0_4_;
    auVar142._4_4_ = fVar57 * auVar101._4_4_;
    auVar142._8_4_ = fVar81 * auVar101._8_4_;
    auVar142._12_4_ = fVar82 * auVar101._12_4_;
    auVar101 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar11 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar1,auVar101);
    local_488._0_4_ = (fVar115 + auVar155._0_4_) * 0.33333334 + (float)local_448._0_4_;
    local_488._4_4_ = (fVar80 + auVar155._4_4_) * 0.33333334 + (float)local_448._4_4_;
    fStack_480 = (fVar56 + auVar155._8_4_) * 0.33333334 + fStack_440;
    fStack_47c = (fVar83 + auVar155._12_4_) * 0.33333334 + fStack_43c;
    local_2f8 = vsubps_avx(_local_488,auVar106);
    auVar101 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar194._0_4_ = auVar101._0_4_ * fVar54;
    auVar194._4_4_ = auVar101._4_4_ * fVar57;
    auVar194._8_4_ = auVar101._8_4_ * fVar81;
    auVar194._12_4_ = auVar101._12_4_ * fVar82;
    auVar101 = vshufps_avx(local_2f8,local_2f8,0x55);
    auVar61 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar1,auVar101);
    auVar205._0_4_ = (fVar172 + auVar89._0_4_) * 0.33333334;
    auVar205._4_4_ = (fVar217 + auVar89._4_4_) * 0.33333334;
    auVar205._8_4_ = (fVar127 + auVar89._8_4_) * 0.33333334;
    auVar205._12_4_ = (fVar136 + auVar89._12_4_) * 0.33333334;
    auVar41._4_4_ = fVar169;
    auVar41._0_4_ = fVar152;
    auVar41._8_4_ = fVar170;
    auVar41._12_4_ = fVar171;
    _local_498 = vsubps_avx(auVar41,auVar205);
    local_308 = vsubps_avx(_local_498,auVar106);
    auVar101 = vshufps_avx(local_308,local_308,0xaa);
    auVar206._0_4_ = auVar101._0_4_ * fVar54;
    auVar206._4_4_ = auVar101._4_4_ * fVar57;
    auVar206._8_4_ = auVar101._8_4_ * fVar81;
    auVar206._12_4_ = auVar101._12_4_ * fVar82;
    auVar101 = vshufps_avx(local_308,local_308,0x55);
    auVar60 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar1,auVar101);
    local_318 = vsubps_avx(auVar41,auVar106);
    auVar101 = vshufps_avx(local_318,local_318,0xaa);
    auVar62._0_4_ = fVar54 * auVar101._0_4_;
    auVar62._4_4_ = fVar57 * auVar101._4_4_;
    auVar62._8_4_ = fVar81 * auVar101._8_4_;
    auVar62._12_4_ = fVar82 * auVar101._12_4_;
    auVar101 = vshufps_avx(local_318,local_318,0x55);
    auVar101 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar101);
    auVar156._4_4_ = local_418._0_4_;
    auVar156._0_4_ = local_418._0_4_;
    auVar156._8_4_ = local_418._0_4_;
    auVar156._12_4_ = local_418._0_4_;
    aVar1 = pre->ray_space[k].vx.field_0;
    auVar106 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar1,auVar156);
    auVar157._4_4_ = local_428._0_4_;
    auVar157._0_4_ = local_428._0_4_;
    auVar157._8_4_ = local_428._0_4_;
    auVar157._12_4_ = local_428._0_4_;
    auVar86 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar1,auVar157);
    uVar55 = local_2c8._0_4_;
    auVar158._4_4_ = uVar55;
    auVar158._0_4_ = uVar55;
    auVar158._8_4_ = uVar55;
    auVar158._12_4_ = uVar55;
    auVar59 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar1,auVar158);
    uVar55 = local_2d8._0_4_;
    auVar159._4_4_ = uVar55;
    auVar159._0_4_ = uVar55;
    auVar159._8_4_ = uVar55;
    auVar159._12_4_ = uVar55;
    auVar87 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar159);
    uVar55 = local_2e8._0_4_;
    auVar160._4_4_ = uVar55;
    auVar160._0_4_ = uVar55;
    auVar160._8_4_ = uVar55;
    auVar160._12_4_ = uVar55;
    auVar11 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar160);
    uVar55 = local_2f8._0_4_;
    auVar161._4_4_ = uVar55;
    auVar161._0_4_ = uVar55;
    auVar161._8_4_ = uVar55;
    auVar161._12_4_ = uVar55;
    auVar61 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar161);
    uVar55 = local_308._0_4_;
    auVar162._4_4_ = uVar55;
    auVar162._0_4_ = uVar55;
    auVar162._8_4_ = uVar55;
    auVar162._12_4_ = uVar55;
    auVar60 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar1,auVar162);
    uVar55 = local_318._0_4_;
    auVar163._4_4_ = uVar55;
    auVar163._0_4_ = uVar55;
    auVar163._8_4_ = uVar55;
    auVar163._12_4_ = uVar55;
    auVar116 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar1,auVar163);
    auVar9 = vmovlhps_avx(auVar106,auVar11);
    auVar10 = vmovlhps_avx(auVar86,auVar61);
    local_3d8 = vmovlhps_avx(auVar59,auVar60);
    _local_278 = vmovlhps_avx(auVar87,auVar116);
    auVar101 = vminps_avx(auVar9,auVar10);
    auVar124 = vminps_avx(local_3d8,_local_278);
    auVar121 = vminps_avx(auVar101,auVar124);
    auVar101 = vmaxps_avx(auVar9,auVar10);
    auVar124 = vmaxps_avx(local_3d8,_local_278);
    auVar101 = vmaxps_avx(auVar101,auVar124);
    auVar124 = vshufpd_avx(auVar121,auVar121,3);
    auVar121 = vminps_avx(auVar121,auVar124);
    auVar124 = vshufpd_avx(auVar101,auVar101,3);
    auVar124 = vmaxps_avx(auVar101,auVar124);
    auVar101 = vandps_avx(local_408,auVar121);
    auVar124 = vandps_avx(local_408,auVar124);
    auVar101 = vmaxps_avx(auVar101,auVar124);
    auVar124 = vmovshdup_avx(auVar101);
    auVar101 = vmaxss_avx(auVar124,auVar101);
    local_78 = auVar101._0_4_ * 9.536743e-07;
    auVar176._8_8_ = auVar106._0_8_;
    auVar176._0_8_ = auVar106._0_8_;
    auVar221._8_8_ = auVar86._0_8_;
    auVar221._0_8_ = auVar86._0_8_;
    auVar241._0_8_ = auVar59._0_8_;
    auVar241._8_8_ = auVar241._0_8_;
    auVar255._0_8_ = auVar87._0_8_;
    auVar255._8_8_ = auVar255._0_8_;
    local_288 = ZEXT416((uint)local_78);
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    fStack_68 = local_78;
    fStack_64 = local_78;
    fStack_60 = local_78;
    fStack_5c = local_78;
    local_98 = -local_78;
    fStack_94 = local_98;
    fStack_90 = local_98;
    fStack_8c = local_98;
    fStack_88 = local_98;
    fStack_84 = local_98;
    fStack_80 = local_98;
    fStack_7c = local_98;
    local_388 = uVar45;
    uStack_384 = uVar45;
    uStack_380 = uVar45;
    uStack_37c = uVar45;
    local_398 = uVar3;
    uStack_394 = uVar3;
    uStack_390 = uVar3;
    uStack_38c = uVar3;
    uVar53 = 0;
    fVar54 = *(float *)(ray + k * 4 + 0x30);
    local_298 = vsubps_avx(auVar10,auVar9);
    local_2a8 = vsubps_avx(local_3d8,auVar10);
    local_2b8 = vsubps_avx(_local_278,local_3d8);
    local_338 = vsubps_avx(_local_448,local_438);
    local_348 = vsubps_avx(_local_488,local_468);
    local_358 = vsubps_avx(_local_498,local_478);
    auVar42._4_4_ = fVar169;
    auVar42._0_4_ = fVar152;
    auVar42._8_4_ = fVar170;
    auVar42._12_4_ = fVar171;
    _local_368 = vsubps_avx(auVar42,local_458);
    auVar63 = ZEXT816(0x3f80000000000000);
    local_328 = auVar63;
LAB_015a7b31:
    auVar101 = vshufps_avx(auVar63,auVar63,0x50);
    auVar273._8_4_ = 0x3f800000;
    auVar273._0_8_ = 0x3f8000003f800000;
    auVar273._12_4_ = 0x3f800000;
    auVar276._16_4_ = 0x3f800000;
    auVar276._0_16_ = auVar273;
    auVar276._20_4_ = 0x3f800000;
    auVar276._24_4_ = 0x3f800000;
    auVar276._28_4_ = 0x3f800000;
    auVar124 = vsubps_avx(auVar273,auVar101);
    fVar57 = auVar101._0_4_;
    fVar127 = auVar11._0_4_;
    auVar64._0_4_ = fVar127 * fVar57;
    fVar81 = auVar101._4_4_;
    fVar136 = auVar11._4_4_;
    auVar64._4_4_ = fVar136 * fVar81;
    fVar82 = auVar101._8_4_;
    auVar64._8_4_ = fVar127 * fVar82;
    fVar115 = auVar101._12_4_;
    auVar64._12_4_ = fVar136 * fVar115;
    fVar238 = auVar61._0_4_;
    auVar164._0_4_ = fVar238 * fVar57;
    fVar250 = auVar61._4_4_;
    auVar164._4_4_ = fVar250 * fVar81;
    auVar164._8_4_ = fVar238 * fVar82;
    auVar164._12_4_ = fVar250 * fVar115;
    fVar190 = auVar60._0_4_;
    auVar129._0_4_ = fVar190 * fVar57;
    fVar200 = auVar60._4_4_;
    auVar129._4_4_ = fVar200 * fVar81;
    auVar129._8_4_ = fVar190 * fVar82;
    auVar129._12_4_ = fVar200 * fVar115;
    fVar201 = auVar116._0_4_;
    auVar108._0_4_ = fVar201 * fVar57;
    fVar216 = auVar116._4_4_;
    auVar108._4_4_ = fVar216 * fVar81;
    auVar108._8_4_ = fVar201 * fVar82;
    auVar108._12_4_ = fVar216 * fVar115;
    auVar86 = vfmadd231ps_fma(auVar64,auVar124,auVar176);
    auVar59 = vfmadd231ps_fma(auVar164,auVar124,auVar221);
    auVar87 = vfmadd231ps_fma(auVar129,auVar124,auVar241);
    auVar234 = vfmadd231ps_fma(auVar108,auVar255,auVar124);
    auVar101 = vmovshdup_avx(local_328);
    fVar57 = local_328._0_4_;
    fStack_140 = (auVar101._0_4_ - fVar57) * 0.04761905;
    auVar214._4_4_ = fVar57;
    auVar214._0_4_ = fVar57;
    auVar214._8_4_ = fVar57;
    auVar214._12_4_ = fVar57;
    auVar214._16_4_ = fVar57;
    auVar214._20_4_ = fVar57;
    auVar214._24_4_ = fVar57;
    auVar214._28_4_ = fVar57;
    auVar102._0_8_ = auVar101._0_8_;
    auVar102._8_8_ = auVar102._0_8_;
    auVar102._16_8_ = auVar102._0_8_;
    auVar102._24_8_ = auVar102._0_8_;
    auVar77 = vsubps_avx(auVar102,auVar214);
    uVar55 = auVar86._0_4_;
    auVar270._4_4_ = uVar55;
    auVar270._0_4_ = uVar55;
    auVar270._8_4_ = uVar55;
    auVar270._12_4_ = uVar55;
    auVar270._16_4_ = uVar55;
    auVar270._20_4_ = uVar55;
    auVar270._24_4_ = uVar55;
    auVar270._28_4_ = uVar55;
    auVar101 = vmovshdup_avx(auVar86);
    uVar84 = auVar101._0_8_;
    auVar263._8_8_ = uVar84;
    auVar263._0_8_ = uVar84;
    auVar263._16_8_ = uVar84;
    auVar263._24_8_ = uVar84;
    fVar217 = auVar59._0_4_;
    auVar246._4_4_ = fVar217;
    auVar246._0_4_ = fVar217;
    auVar246._8_4_ = fVar217;
    auVar246._12_4_ = fVar217;
    auVar246._16_4_ = fVar217;
    auVar246._20_4_ = fVar217;
    auVar246._24_4_ = fVar217;
    auVar246._28_4_ = fVar217;
    auVar124 = vmovshdup_avx(auVar59);
    auVar103._0_8_ = auVar124._0_8_;
    auVar103._8_8_ = auVar103._0_8_;
    auVar103._16_8_ = auVar103._0_8_;
    auVar103._24_8_ = auVar103._0_8_;
    fVar172 = auVar87._0_4_;
    auVar182._4_4_ = fVar172;
    auVar182._0_4_ = fVar172;
    auVar182._8_4_ = fVar172;
    auVar182._12_4_ = fVar172;
    auVar182._16_4_ = fVar172;
    auVar182._20_4_ = fVar172;
    auVar182._24_4_ = fVar172;
    auVar182._28_4_ = fVar172;
    auVar121 = vmovshdup_avx(auVar87);
    auVar198._0_8_ = auVar121._0_8_;
    auVar198._8_8_ = auVar198._0_8_;
    auVar198._16_8_ = auVar198._0_8_;
    auVar198._24_8_ = auVar198._0_8_;
    fVar83 = auVar234._0_4_;
    auVar106 = vmovshdup_avx(auVar234);
    auVar58 = vfmadd132ps_fma(auVar77,auVar214,_DAT_01faff20);
    auVar77 = vsubps_avx(auVar276,ZEXT1632(auVar58));
    fVar57 = auVar58._0_4_;
    fVar81 = auVar58._4_4_;
    auVar12._4_4_ = fVar217 * fVar81;
    auVar12._0_4_ = fVar217 * fVar57;
    fVar82 = auVar58._8_4_;
    auVar12._8_4_ = fVar217 * fVar82;
    fVar115 = auVar58._12_4_;
    auVar12._12_4_ = fVar217 * fVar115;
    auVar12._16_4_ = fVar217 * 0.0;
    auVar12._20_4_ = fVar217 * 0.0;
    auVar12._24_4_ = fVar217 * 0.0;
    auVar12._28_4_ = 0x3f800000;
    auVar58 = vfmadd231ps_fma(auVar12,auVar77,auVar270);
    fVar80 = auVar124._0_4_;
    fVar56 = auVar124._4_4_;
    auVar13._4_4_ = fVar56 * fVar81;
    auVar13._0_4_ = fVar80 * fVar57;
    auVar13._8_4_ = fVar80 * fVar82;
    auVar13._12_4_ = fVar56 * fVar115;
    auVar13._16_4_ = fVar80 * 0.0;
    auVar13._20_4_ = fVar56 * 0.0;
    auVar13._24_4_ = fVar80 * 0.0;
    auVar13._28_4_ = uVar55;
    auVar85 = vfmadd231ps_fma(auVar13,auVar77,auVar263);
    auVar14._4_4_ = fVar172 * fVar81;
    auVar14._0_4_ = fVar172 * fVar57;
    auVar14._8_4_ = fVar172 * fVar82;
    auVar14._12_4_ = fVar172 * fVar115;
    auVar14._16_4_ = fVar172 * 0.0;
    auVar14._20_4_ = fVar172 * 0.0;
    auVar14._24_4_ = fVar172 * 0.0;
    auVar14._28_4_ = auVar101._4_4_;
    auVar118 = vfmadd231ps_fma(auVar14,auVar77,auVar246);
    fVar80 = auVar121._0_4_;
    fVar56 = auVar121._4_4_;
    auVar8._4_4_ = fVar56 * fVar81;
    auVar8._0_4_ = fVar80 * fVar57;
    auVar8._8_4_ = fVar80 * fVar82;
    auVar8._12_4_ = fVar56 * fVar115;
    auVar8._16_4_ = fVar80 * 0.0;
    auVar8._20_4_ = fVar56 * 0.0;
    auVar8._24_4_ = fVar80 * 0.0;
    auVar8._28_4_ = fVar217;
    auVar137 = vfmadd231ps_fma(auVar8,auVar77,auVar103);
    auVar101 = vshufps_avx(auVar86,auVar86,0xaa);
    local_548._8_8_ = auVar101._0_8_;
    local_548._0_8_ = local_548._8_8_;
    local_548._16_8_ = local_548._8_8_;
    local_548._24_8_ = local_548._8_8_;
    auVar124 = vshufps_avx(auVar86,auVar86,0xff);
    uStack_600 = auVar124._0_8_;
    local_608 = (undefined1  [8])uStack_600;
    uStack_5f8 = uStack_600;
    uStack_5f0 = uStack_600;
    auVar15._4_4_ = fVar83 * fVar81;
    auVar15._0_4_ = fVar83 * fVar57;
    auVar15._8_4_ = fVar83 * fVar82;
    auVar15._12_4_ = fVar83 * fVar115;
    auVar15._16_4_ = fVar83 * 0.0;
    auVar15._20_4_ = fVar83 * 0.0;
    auVar15._24_4_ = fVar83 * 0.0;
    auVar15._28_4_ = fVar83;
    auVar86 = vfmadd231ps_fma(auVar15,auVar77,auVar182);
    auVar124 = vshufps_avx(auVar59,auVar59,0xaa);
    auVar183._0_8_ = auVar124._0_8_;
    auVar183._8_8_ = auVar183._0_8_;
    auVar183._16_8_ = auVar183._0_8_;
    auVar183._24_8_ = auVar183._0_8_;
    auVar121 = vshufps_avx(auVar59,auVar59,0xff);
    local_4e8._8_8_ = auVar121._0_8_;
    local_4e8._0_8_ = local_4e8._8_8_;
    local_4e8._16_8_ = local_4e8._8_8_;
    local_4e8._24_8_ = local_4e8._8_8_;
    fVar80 = auVar106._0_4_;
    fVar56 = auVar106._4_4_;
    auVar248._4_4_ = fVar56 * fVar81;
    auVar248._0_4_ = fVar80 * fVar57;
    auVar248._8_4_ = fVar80 * fVar82;
    auVar248._12_4_ = fVar56 * fVar115;
    auVar248._16_4_ = fVar80 * 0.0;
    auVar248._20_4_ = fVar56 * 0.0;
    auVar248._24_4_ = fVar80 * 0.0;
    auVar248._28_4_ = auVar101._4_4_;
    auVar138 = vfmadd231ps_fma(auVar248,auVar77,auVar198);
    auVar17._28_4_ = fVar56;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar118._12_4_ * fVar115,
                            CONCAT48(auVar118._8_4_ * fVar82,
                                     CONCAT44(auVar118._4_4_ * fVar81,auVar118._0_4_ * fVar57))));
    auVar58 = vfmadd231ps_fma(auVar17,auVar77,ZEXT1632(auVar58));
    fVar80 = auVar121._4_4_;
    auVar18._28_4_ = fVar80;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar137._12_4_ * fVar115,
                            CONCAT48(auVar137._8_4_ * fVar82,
                                     CONCAT44(auVar137._4_4_ * fVar81,auVar137._0_4_ * fVar57))));
    auVar85 = vfmadd231ps_fma(auVar18,auVar77,ZEXT1632(auVar85));
    auVar101 = vshufps_avx(auVar87,auVar87,0xaa);
    uVar84 = auVar101._0_8_;
    auVar168._8_8_ = uVar84;
    auVar168._0_8_ = uVar84;
    auVar168._16_8_ = uVar84;
    auVar168._24_8_ = uVar84;
    auVar106 = vshufps_avx(auVar87,auVar87,0xff);
    uVar84 = auVar106._0_8_;
    auVar277._8_8_ = uVar84;
    auVar277._0_8_ = uVar84;
    auVar277._16_8_ = uVar84;
    auVar277._24_8_ = uVar84;
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar86._12_4_ * fVar115,
                                                 CONCAT48(auVar86._8_4_ * fVar82,
                                                          CONCAT44(auVar86._4_4_ * fVar81,
                                                                   auVar86._0_4_ * fVar57)))),
                              auVar77,ZEXT1632(auVar118));
    auVar86 = vshufps_avx(auVar234,auVar234,0xaa);
    auVar59 = vshufps_avx(auVar234,auVar234,0xff);
    auVar234 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar138._12_4_,
                                                  CONCAT48(fVar82 * auVar138._8_4_,
                                                           CONCAT44(fVar81 * auVar138._4_4_,
                                                                    fVar57 * auVar138._0_4_)))),
                               auVar77,ZEXT1632(auVar137));
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar87._12_4_,
                                                  CONCAT48(fVar82 * auVar87._8_4_,
                                                           CONCAT44(fVar81 * auVar87._4_4_,
                                                                    fVar57 * auVar87._0_4_)))),
                               auVar77,ZEXT1632(auVar58));
    auVar12 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar58));
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar234._12_4_,
                                                 CONCAT48(fVar82 * auVar234._8_4_,
                                                          CONCAT44(fVar81 * auVar234._4_4_,
                                                                   fVar57 * auVar234._0_4_)))),
                              auVar77,ZEXT1632(auVar85));
    auVar13 = vsubps_avx(ZEXT1632(auVar234),ZEXT1632(auVar85));
    fVar56 = auVar13._28_4_;
    auVar247._0_4_ = fStack_140 * auVar12._0_4_ * 3.0;
    auVar247._4_4_ = fStack_140 * auVar12._4_4_ * 3.0;
    auVar247._8_4_ = fStack_140 * auVar12._8_4_ * 3.0;
    auVar247._12_4_ = fStack_140 * auVar12._12_4_ * 3.0;
    auVar247._16_4_ = fStack_140 * auVar12._16_4_ * 3.0;
    auVar247._20_4_ = fStack_140 * auVar12._20_4_ * 3.0;
    auVar247._24_4_ = fStack_140 * auVar12._24_4_ * 3.0;
    auVar247._28_4_ = 0;
    local_3f8._0_4_ = fStack_140 * auVar13._0_4_ * 3.0;
    local_3f8._4_4_ = fStack_140 * auVar13._4_4_ * 3.0;
    fStack_3f0 = fStack_140 * auVar13._8_4_ * 3.0;
    fStack_3ec = fStack_140 * auVar13._12_4_ * 3.0;
    fStack_3e8 = fStack_140 * auVar13._16_4_ * 3.0;
    fStack_3e4 = fStack_140 * auVar13._20_4_ * 3.0;
    fStack_3e0 = fStack_140 * auVar13._24_4_ * 3.0;
    fStack_3dc = fVar56;
    fVar83 = auVar124._0_4_;
    fVar172 = auVar124._4_4_;
    auVar19._4_4_ = fVar172 * fVar81;
    auVar19._0_4_ = fVar83 * fVar57;
    auVar19._8_4_ = fVar83 * fVar82;
    auVar19._12_4_ = fVar172 * fVar115;
    auVar19._16_4_ = fVar83 * 0.0;
    auVar19._20_4_ = fVar172 * 0.0;
    auVar19._24_4_ = fVar83 * 0.0;
    auVar19._28_4_ = fVar56;
    auVar124 = vfmadd231ps_fma(auVar19,auVar77,local_548);
    fVar83 = auVar121._0_4_;
    auVar20._4_4_ = fVar80 * fVar81;
    auVar20._0_4_ = fVar83 * fVar57;
    auVar20._8_4_ = fVar83 * fVar82;
    auVar20._12_4_ = fVar80 * fVar115;
    auVar20._16_4_ = fVar83 * 0.0;
    auVar20._20_4_ = fVar80 * 0.0;
    auVar20._24_4_ = fVar83 * 0.0;
    auVar20._28_4_ = 0;
    auVar121 = vfmadd231ps_fma(auVar20,auVar77,_local_608);
    fVar80 = auVar101._0_4_;
    fVar83 = auVar101._4_4_;
    auVar21._4_4_ = fVar83 * fVar81;
    auVar21._0_4_ = fVar80 * fVar57;
    auVar21._8_4_ = fVar80 * fVar82;
    auVar21._12_4_ = fVar83 * fVar115;
    auVar21._16_4_ = fVar80 * 0.0;
    auVar21._20_4_ = fVar83 * 0.0;
    auVar21._24_4_ = fVar80 * 0.0;
    auVar21._28_4_ = auVar12._28_4_;
    auVar101 = vfmadd231ps_fma(auVar21,auVar77,auVar183);
    fVar80 = auVar106._0_4_;
    fVar217 = auVar106._4_4_;
    auVar22._4_4_ = fVar217 * fVar81;
    auVar22._0_4_ = fVar80 * fVar57;
    auVar22._8_4_ = fVar80 * fVar82;
    auVar22._12_4_ = fVar217 * fVar115;
    auVar22._16_4_ = fVar80 * 0.0;
    auVar22._20_4_ = fVar217 * 0.0;
    auVar22._24_4_ = fVar80 * 0.0;
    auVar22._28_4_ = fVar172;
    auVar106 = vfmadd231ps_fma(auVar22,auVar77,local_4e8);
    local_4e8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar118));
    fVar80 = auVar86._0_4_;
    fVar83 = auVar86._4_4_;
    auVar23._4_4_ = fVar83 * fVar81;
    auVar23._0_4_ = fVar80 * fVar57;
    auVar23._8_4_ = fVar80 * fVar82;
    auVar23._12_4_ = fVar83 * fVar115;
    auVar23._16_4_ = fVar80 * 0.0;
    auVar23._20_4_ = fVar83 * 0.0;
    auVar23._24_4_ = fVar80 * 0.0;
    auVar23._28_4_ = fVar83;
    auVar86 = vfmadd231ps_fma(auVar23,auVar77,auVar168);
    auVar15 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar87));
    fVar80 = auVar59._0_4_;
    fVar83 = auVar59._4_4_;
    auVar24._4_4_ = fVar83 * fVar81;
    auVar24._0_4_ = fVar80 * fVar57;
    auVar24._8_4_ = fVar80 * fVar82;
    auVar24._12_4_ = fVar83 * fVar115;
    auVar24._16_4_ = fVar80 * 0.0;
    auVar24._20_4_ = fVar83 * 0.0;
    auVar24._24_4_ = fVar80 * 0.0;
    auVar24._28_4_ = fVar83;
    auVar59 = vfmadd231ps_fma(auVar24,auVar77,auVar277);
    auVar25._28_4_ = fVar217;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(auVar101._12_4_ * fVar115,
                            CONCAT48(auVar101._8_4_ * fVar82,
                                     CONCAT44(auVar101._4_4_ * fVar81,auVar101._0_4_ * fVar57))));
    auVar124 = vfmadd231ps_fma(auVar25,auVar77,ZEXT1632(auVar124));
    auVar121 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar106._12_4_,
                                                  CONCAT48(fVar82 * auVar106._8_4_,
                                                           CONCAT44(fVar81 * auVar106._4_4_,
                                                                    fVar57 * auVar106._0_4_)))),
                               auVar77,ZEXT1632(auVar121));
    auVar104._0_4_ = auVar118._0_4_ + auVar247._0_4_;
    auVar104._4_4_ = auVar118._4_4_ + auVar247._4_4_;
    auVar104._8_4_ = auVar118._8_4_ + auVar247._8_4_;
    auVar104._12_4_ = auVar118._12_4_ + auVar247._12_4_;
    auVar104._16_4_ = auVar247._16_4_ + 0.0;
    auVar104._20_4_ = auVar247._20_4_ + 0.0;
    auVar104._24_4_ = auVar247._24_4_ + 0.0;
    auVar104._28_4_ = 0;
    auVar101 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar86._12_4_ * fVar115,
                                                  CONCAT48(auVar86._8_4_ * fVar82,
                                                           CONCAT44(auVar86._4_4_ * fVar81,
                                                                    auVar86._0_4_ * fVar57)))),
                               auVar77,ZEXT1632(auVar101));
    auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar59._12_4_ * fVar115,
                                                  CONCAT48(auVar59._8_4_ * fVar82,
                                                           CONCAT44(auVar59._4_4_ * fVar81,
                                                                    auVar59._0_4_ * fVar57)))),
                               auVar77,ZEXT1632(auVar106));
    auVar86 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar101._12_4_,
                                                 CONCAT48(fVar82 * auVar101._8_4_,
                                                          CONCAT44(fVar81 * auVar101._4_4_,
                                                                   fVar57 * auVar101._0_4_)))),
                              auVar77,ZEXT1632(auVar124));
    auVar59 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar106._12_4_ * fVar115,
                                                 CONCAT48(auVar106._8_4_ * fVar82,
                                                          CONCAT44(auVar106._4_4_ * fVar81,
                                                                   auVar106._0_4_ * fVar57)))),
                              ZEXT1632(auVar121),auVar77);
    auVar77 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar124));
    auVar12 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar121));
    auVar271._0_4_ = fStack_140 * auVar77._0_4_ * 3.0;
    auVar271._4_4_ = fStack_140 * auVar77._4_4_ * 3.0;
    auVar271._8_4_ = fStack_140 * auVar77._8_4_ * 3.0;
    auVar271._12_4_ = fStack_140 * auVar77._12_4_ * 3.0;
    auVar271._16_4_ = fStack_140 * auVar77._16_4_ * 3.0;
    auVar271._20_4_ = fStack_140 * auVar77._20_4_ * 3.0;
    auVar271._24_4_ = fStack_140 * auVar77._24_4_ * 3.0;
    auVar271._28_4_ = 0;
    local_158 = fStack_140 * auVar12._0_4_ * 3.0;
    fStack_154 = fStack_140 * auVar12._4_4_ * 3.0;
    auVar26._4_4_ = fStack_154;
    auVar26._0_4_ = local_158;
    fStack_150 = fStack_140 * auVar12._8_4_ * 3.0;
    auVar26._8_4_ = fStack_150;
    fStack_14c = fStack_140 * auVar12._12_4_ * 3.0;
    auVar26._12_4_ = fStack_14c;
    fStack_148 = fStack_140 * auVar12._16_4_ * 3.0;
    auVar26._16_4_ = fStack_148;
    fStack_144 = fStack_140 * auVar12._20_4_ * 3.0;
    auVar26._20_4_ = fStack_144;
    fStack_140 = fStack_140 * auVar12._24_4_ * 3.0;
    auVar26._24_4_ = fStack_140;
    auVar26._28_4_ = 0x40400000;
    _local_508 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar86));
    _local_3b8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar59));
    auVar77 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar118));
    auVar12 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar87));
    auVar13 = vsubps_avx(_local_508,local_4e8);
    fVar251 = auVar77._0_4_ + auVar13._0_4_;
    fVar252 = auVar77._4_4_ + auVar13._4_4_;
    fVar185 = auVar77._8_4_ + auVar13._8_4_;
    fVar186 = auVar77._12_4_ + auVar13._12_4_;
    fVar187 = auVar77._16_4_ + auVar13._16_4_;
    fVar188 = auVar77._20_4_ + auVar13._20_4_;
    fVar189 = auVar77._24_4_ + auVar13._24_4_;
    auVar14 = vsubps_avx(_local_3b8,auVar15);
    auVar78._0_4_ = auVar12._0_4_ + auVar14._0_4_;
    auVar78._4_4_ = auVar12._4_4_ + auVar14._4_4_;
    auVar78._8_4_ = auVar12._8_4_ + auVar14._8_4_;
    auVar78._12_4_ = auVar12._12_4_ + auVar14._12_4_;
    auVar78._16_4_ = auVar12._16_4_ + auVar14._16_4_;
    auVar78._20_4_ = auVar12._20_4_ + auVar14._20_4_;
    auVar78._24_4_ = auVar12._24_4_ + auVar14._24_4_;
    auVar78._28_4_ = auVar12._28_4_ + auVar14._28_4_;
    local_f8 = ZEXT1632(auVar87);
    fVar57 = auVar87._0_4_;
    local_178 = (float)local_3f8._0_4_ + fVar57;
    fVar81 = auVar87._4_4_;
    fStack_174 = (float)local_3f8._4_4_ + fVar81;
    fVar82 = auVar87._8_4_;
    fStack_170 = fStack_3f0 + fVar82;
    fVar115 = auVar87._12_4_;
    fStack_16c = fStack_3ec + fVar115;
    fStack_168 = fStack_3e8 + 0.0;
    fStack_164 = fStack_3e4 + 0.0;
    fStack_160 = fStack_3e0 + 0.0;
    local_b8 = ZEXT1632(auVar118);
    auVar12 = vsubps_avx(local_b8,auVar247);
    local_d8 = vpermps_avx2(_DAT_01fec480,auVar12);
    auVar12 = vsubps_avx(local_f8,_local_3f8);
    local_198 = vpermps_avx2(_DAT_01fec480,auVar12);
    local_118._0_4_ = auVar86._0_4_ + auVar271._0_4_;
    local_118._4_4_ = auVar86._4_4_ + auVar271._4_4_;
    local_118._8_4_ = auVar86._8_4_ + auVar271._8_4_;
    local_118._12_4_ = auVar86._12_4_ + auVar271._12_4_;
    local_118._16_4_ = auVar271._16_4_ + 0.0;
    local_118._20_4_ = auVar271._20_4_ + 0.0;
    local_118._24_4_ = auVar271._24_4_ + 0.0;
    local_118._28_4_ = 0;
    auVar215 = ZEXT3264(local_118);
    auVar248 = ZEXT1632(auVar86);
    auVar12 = vsubps_avx(auVar248,auVar271);
    _local_3f8 = vpermps_avx2(_DAT_01fec480,auVar12);
    fVar80 = auVar59._0_4_;
    local_158 = fVar80 + local_158;
    fVar83 = auVar59._4_4_;
    fStack_154 = fVar83 + fStack_154;
    fVar172 = auVar59._8_4_;
    fStack_150 = fVar172 + fStack_150;
    fVar217 = auVar59._12_4_;
    fStack_14c = fVar217 + fStack_14c;
    fStack_148 = fStack_148 + 0.0;
    fStack_144 = fStack_144 + 0.0;
    fStack_140 = fStack_140 + 0.0;
    auVar12 = vsubps_avx(ZEXT1632(auVar59),auVar26);
    local_138 = vpermps_avx2(_DAT_01fec480,auVar12);
    auVar27._4_4_ = fVar81 * fVar252;
    auVar27._0_4_ = fVar57 * fVar251;
    auVar27._8_4_ = fVar82 * fVar185;
    auVar27._12_4_ = fVar115 * fVar186;
    auVar27._16_4_ = fVar187 * 0.0;
    auVar27._20_4_ = fVar188 * 0.0;
    auVar27._24_4_ = fVar189 * 0.0;
    auVar27._28_4_ = auVar12._28_4_;
    auVar101 = vfnmadd231ps_fma(auVar27,local_b8,auVar78);
    fStack_15c = fVar56 + 0.0;
    auVar28._4_4_ = fStack_174 * fVar252;
    auVar28._0_4_ = local_178 * fVar251;
    auVar28._8_4_ = fStack_170 * fVar185;
    auVar28._12_4_ = fStack_16c * fVar186;
    auVar28._16_4_ = fStack_168 * fVar187;
    auVar28._20_4_ = fStack_164 * fVar188;
    auVar28._24_4_ = fStack_160 * fVar189;
    auVar28._28_4_ = 0;
    auVar124 = vfnmadd231ps_fma(auVar28,auVar78,auVar104);
    auVar29._4_4_ = local_198._4_4_ * fVar252;
    auVar29._0_4_ = local_198._0_4_ * fVar251;
    auVar29._8_4_ = local_198._8_4_ * fVar185;
    auVar29._12_4_ = local_198._12_4_ * fVar186;
    auVar29._16_4_ = local_198._16_4_ * fVar187;
    auVar29._20_4_ = local_198._20_4_ * fVar188;
    auVar29._24_4_ = local_198._24_4_ * fVar189;
    auVar29._28_4_ = fVar56 + 0.0;
    auVar121 = vfnmadd231ps_fma(auVar29,local_d8,auVar78);
    local_608._0_4_ = auVar15._0_4_;
    local_608._4_4_ = auVar15._4_4_;
    uStack_600._0_4_ = auVar15._8_4_;
    uStack_600._4_4_ = auVar15._12_4_;
    uStack_5f8._0_4_ = auVar15._16_4_;
    uStack_5f8._4_4_ = auVar15._20_4_;
    uStack_5f0._0_4_ = auVar15._24_4_;
    uStack_5f0._4_4_ = auVar15._28_4_;
    auVar30._4_4_ = (float)local_608._4_4_ * fVar252;
    auVar30._0_4_ = (float)local_608._0_4_ * fVar251;
    auVar30._8_4_ = (float)uStack_600 * fVar185;
    auVar30._12_4_ = uStack_600._4_4_ * fVar186;
    auVar30._16_4_ = (float)uStack_5f8 * fVar187;
    auVar30._20_4_ = uStack_5f8._4_4_ * fVar188;
    auVar30._24_4_ = (float)uStack_5f0 * fVar189;
    auVar30._28_4_ = uStack_5f0._4_4_;
    auVar106 = vfnmadd231ps_fma(auVar30,local_4e8,auVar78);
    auVar199._0_4_ = fVar80 * fVar251;
    auVar199._4_4_ = fVar83 * fVar252;
    auVar199._8_4_ = fVar172 * fVar185;
    auVar199._12_4_ = fVar217 * fVar186;
    auVar199._16_4_ = fVar187 * 0.0;
    auVar199._20_4_ = fVar188 * 0.0;
    auVar199._24_4_ = fVar189 * 0.0;
    auVar199._28_4_ = 0;
    auVar86 = vfnmadd231ps_fma(auVar199,auVar248,auVar78);
    uStack_13c = 0x40400000;
    auVar31._4_4_ = fStack_154 * fVar252;
    auVar31._0_4_ = local_158 * fVar251;
    auVar31._8_4_ = fStack_150 * fVar185;
    auVar31._12_4_ = fStack_14c * fVar186;
    auVar31._16_4_ = fStack_148 * fVar187;
    auVar31._20_4_ = fStack_144 * fVar188;
    auVar31._24_4_ = fStack_140 * fVar189;
    auVar31._28_4_ = local_4e8._28_4_;
    auVar87 = vfnmadd231ps_fma(auVar31,local_118,auVar78);
    auVar32._4_4_ = local_138._4_4_ * fVar252;
    auVar32._0_4_ = local_138._0_4_ * fVar251;
    auVar32._8_4_ = local_138._8_4_ * fVar185;
    auVar32._12_4_ = local_138._12_4_ * fVar186;
    auVar32._16_4_ = local_138._16_4_ * fVar187;
    auVar32._20_4_ = local_138._20_4_ * fVar188;
    auVar32._24_4_ = local_138._24_4_ * fVar189;
    auVar32._28_4_ = local_138._28_4_;
    auVar234 = vfnmadd231ps_fma(auVar32,_local_3f8,auVar78);
    auVar33._4_4_ = local_3b8._4_4_ * fVar252;
    auVar33._0_4_ = local_3b8._0_4_ * fVar251;
    auVar33._8_4_ = local_3b8._8_4_ * fVar185;
    auVar33._12_4_ = local_3b8._12_4_ * fVar186;
    auVar33._16_4_ = local_3b8._16_4_ * fVar187;
    auVar33._20_4_ = local_3b8._20_4_ * fVar188;
    auVar33._24_4_ = local_3b8._24_4_ * fVar189;
    auVar33._28_4_ = auVar77._28_4_ + auVar13._28_4_;
    auVar58 = vfnmadd231ps_fma(auVar33,_local_508,auVar78);
    auVar12 = vminps_avx(ZEXT1632(auVar101),ZEXT1632(auVar124));
    auVar77 = vmaxps_avx(ZEXT1632(auVar101),ZEXT1632(auVar124));
    auVar13 = vminps_avx(ZEXT1632(auVar121),ZEXT1632(auVar106));
    auVar13 = vminps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(ZEXT1632(auVar121),ZEXT1632(auVar106));
    auVar77 = vmaxps_avx(auVar77,auVar12);
    auVar14 = vminps_avx(ZEXT1632(auVar86),ZEXT1632(auVar87));
    auVar12 = vmaxps_avx(ZEXT1632(auVar86),ZEXT1632(auVar87));
    auVar8 = vminps_avx(ZEXT1632(auVar234),ZEXT1632(auVar58));
    auVar14 = vminps_avx(auVar14,auVar8);
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar234),ZEXT1632(auVar58));
    auVar12 = vmaxps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(auVar77,auVar12);
    auVar44._4_4_ = fStack_74;
    auVar44._0_4_ = local_78;
    auVar44._8_4_ = fStack_70;
    auVar44._12_4_ = fStack_6c;
    auVar44._16_4_ = fStack_68;
    auVar44._20_4_ = fStack_64;
    auVar44._24_4_ = fStack_60;
    auVar44._28_4_ = fStack_5c;
    auVar77 = vcmpps_avx(auVar14,auVar44,2);
    auVar43._4_4_ = fStack_94;
    auVar43._0_4_ = local_98;
    auVar43._8_4_ = fStack_90;
    auVar43._12_4_ = fStack_8c;
    auVar43._16_4_ = fStack_88;
    auVar43._20_4_ = fStack_84;
    auVar43._24_4_ = fStack_80;
    auVar43._28_4_ = fStack_7c;
    auVar12 = vcmpps_avx(auVar12,auVar43,5);
    auVar77 = vandps_avx(auVar12,auVar77);
    auVar12 = local_1b8 & auVar77;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar12 = vsubps_avx(local_4e8,local_b8);
      auVar13 = vsubps_avx(_local_508,auVar248);
      fVar251 = auVar12._0_4_ + auVar13._0_4_;
      fVar252 = auVar12._4_4_ + auVar13._4_4_;
      fVar185 = auVar12._8_4_ + auVar13._8_4_;
      fVar186 = auVar12._12_4_ + auVar13._12_4_;
      fVar187 = auVar12._16_4_ + auVar13._16_4_;
      fVar188 = auVar12._20_4_ + auVar13._20_4_;
      fVar189 = auVar12._24_4_ + auVar13._24_4_;
      auVar14 = vsubps_avx(auVar15,local_f8);
      auVar8 = vsubps_avx(_local_3b8,ZEXT1632(auVar59));
      auVar105._0_4_ = auVar14._0_4_ + auVar8._0_4_;
      auVar105._4_4_ = auVar14._4_4_ + auVar8._4_4_;
      auVar105._8_4_ = auVar14._8_4_ + auVar8._8_4_;
      auVar105._12_4_ = auVar14._12_4_ + auVar8._12_4_;
      auVar105._16_4_ = auVar14._16_4_ + auVar8._16_4_;
      auVar105._20_4_ = auVar14._20_4_ + auVar8._20_4_;
      auVar105._24_4_ = auVar14._24_4_ + auVar8._24_4_;
      fVar56 = auVar8._28_4_;
      auVar105._28_4_ = auVar14._28_4_ + fVar56;
      auVar34._4_4_ = fVar81 * fVar252;
      auVar34._0_4_ = fVar57 * fVar251;
      auVar34._8_4_ = fVar82 * fVar185;
      auVar34._12_4_ = fVar115 * fVar186;
      auVar34._16_4_ = fVar187 * 0.0;
      auVar34._20_4_ = fVar188 * 0.0;
      auVar34._24_4_ = fVar189 * 0.0;
      auVar34._28_4_ = local_508._28_4_;
      auVar86 = vfnmadd231ps_fma(auVar34,auVar105,local_b8);
      auVar35._4_4_ = fVar252 * fStack_174;
      auVar35._0_4_ = fVar251 * local_178;
      auVar35._8_4_ = fVar185 * fStack_170;
      auVar35._12_4_ = fVar186 * fStack_16c;
      auVar35._16_4_ = fVar187 * fStack_168;
      auVar35._20_4_ = fVar188 * fStack_164;
      auVar35._24_4_ = fVar189 * fStack_160;
      auVar35._28_4_ = 0;
      auVar101 = vfnmadd213ps_fma(auVar104,auVar105,auVar35);
      auVar36._4_4_ = fVar252 * local_198._4_4_;
      auVar36._0_4_ = fVar251 * local_198._0_4_;
      auVar36._8_4_ = fVar185 * local_198._8_4_;
      auVar36._12_4_ = fVar186 * local_198._12_4_;
      auVar36._16_4_ = fVar187 * local_198._16_4_;
      auVar36._20_4_ = fVar188 * local_198._20_4_;
      auVar36._24_4_ = fVar189 * local_198._24_4_;
      auVar36._28_4_ = 0;
      auVar124 = vfnmadd213ps_fma(local_d8,auVar105,auVar36);
      auVar37._4_4_ = (float)local_608._4_4_ * fVar252;
      auVar37._0_4_ = (float)local_608._0_4_ * fVar251;
      auVar37._8_4_ = (float)uStack_600 * fVar185;
      auVar37._12_4_ = uStack_600._4_4_ * fVar186;
      auVar37._16_4_ = (float)uStack_5f8 * fVar187;
      auVar37._20_4_ = uStack_5f8._4_4_ * fVar188;
      auVar37._24_4_ = (float)uStack_5f0 * fVar189;
      auVar37._28_4_ = 0;
      auVar59 = vfnmadd231ps_fma(auVar37,auVar105,local_4e8);
      auVar125._0_4_ = fVar80 * fVar251;
      auVar125._4_4_ = fVar83 * fVar252;
      auVar125._8_4_ = fVar172 * fVar185;
      auVar125._12_4_ = fVar217 * fVar186;
      auVar125._16_4_ = fVar187 * 0.0;
      auVar125._20_4_ = fVar188 * 0.0;
      auVar125._24_4_ = fVar189 * 0.0;
      auVar125._28_4_ = 0;
      auVar87 = vfnmadd231ps_fma(auVar125,auVar105,auVar248);
      auVar38._4_4_ = fVar252 * fStack_154;
      auVar38._0_4_ = fVar251 * local_158;
      auVar38._8_4_ = fVar185 * fStack_150;
      auVar38._12_4_ = fVar186 * fStack_14c;
      auVar38._16_4_ = fVar187 * fStack_148;
      auVar38._20_4_ = fVar188 * fStack_144;
      auVar38._24_4_ = fVar189 * fStack_140;
      auVar38._28_4_ = fVar56;
      auVar121 = vfnmadd213ps_fma(local_118,auVar105,auVar38);
      auVar39._4_4_ = fVar252 * local_138._4_4_;
      auVar39._0_4_ = fVar251 * local_138._0_4_;
      auVar39._8_4_ = fVar185 * local_138._8_4_;
      auVar39._12_4_ = fVar186 * local_138._12_4_;
      auVar39._16_4_ = fVar187 * local_138._16_4_;
      auVar39._20_4_ = fVar188 * local_138._20_4_;
      auVar39._24_4_ = fVar189 * local_138._24_4_;
      auVar39._28_4_ = fVar56;
      auVar106 = vfnmadd213ps_fma(_local_3f8,auVar105,auVar39);
      auVar215 = ZEXT1664(auVar106);
      auVar40._4_4_ = fVar252 * local_3b8._4_4_;
      auVar40._0_4_ = fVar251 * local_3b8._0_4_;
      auVar40._8_4_ = fVar185 * local_3b8._8_4_;
      auVar40._12_4_ = fVar186 * local_3b8._12_4_;
      auVar40._16_4_ = fVar187 * local_3b8._16_4_;
      auVar40._20_4_ = fVar188 * local_3b8._20_4_;
      auVar40._24_4_ = fVar189 * local_3b8._24_4_;
      auVar40._28_4_ = auVar12._28_4_ + auVar13._28_4_;
      auVar234 = vfnmadd231ps_fma(auVar40,auVar105,_local_508);
      auVar13 = vminps_avx(ZEXT1632(auVar86),ZEXT1632(auVar101));
      auVar12 = vmaxps_avx(ZEXT1632(auVar86),ZEXT1632(auVar101));
      auVar14 = vminps_avx(ZEXT1632(auVar124),ZEXT1632(auVar59));
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(ZEXT1632(auVar124),ZEXT1632(auVar59));
      auVar12 = vmaxps_avx(auVar12,auVar13);
      auVar8 = vminps_avx(ZEXT1632(auVar87),ZEXT1632(auVar121));
      auVar13 = vmaxps_avx(ZEXT1632(auVar87),ZEXT1632(auVar121));
      auVar15 = vminps_avx(ZEXT1632(auVar106),ZEXT1632(auVar234));
      auVar8 = vminps_avx(auVar8,auVar15);
      auVar8 = vminps_avx(auVar14,auVar8);
      auVar14 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar234));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vcmpps_avx(auVar8,auVar44,2);
      auVar13 = vcmpps_avx(auVar13,auVar43,5);
      auVar12 = vandps_avx(auVar13,auVar12);
      auVar77 = vandps_avx(auVar77,local_1b8);
      auVar13 = auVar77 & auVar12;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') {
        auVar77 = vandps_avx(auVar12,auVar77);
        uVar50 = vmovmskps_avx(auVar77);
        if (uVar50 != 0) {
          uVar52 = (ulong)uVar53;
          auStack_3c8[uVar52] = uVar50 & 0xff;
          uVar84 = vmovlps_avx(local_328);
          *(undefined8 *)(&uStack_268 + uVar52 * 2) = uVar84;
          uVar46 = vmovlps_avx(auVar63);
          auStack_58[uVar52] = uVar46;
          uVar53 = uVar53 + 1;
        }
      }
    }
    auVar249 = ZEXT464(0x3f800000);
    if (uVar53 != 0) {
      do {
        uVar52 = (ulong)(uVar53 - 1);
        uVar49 = auStack_3c8[uVar52];
        uVar50 = (&uStack_268)[uVar52 * 2];
        fVar57 = afStack_264[uVar52 * 2];
        iVar16 = 0;
        for (uVar46 = (ulong)uVar49; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
          iVar16 = iVar16 + 1;
        }
        uVar49 = uVar49 - 1 & uVar49;
        if (uVar49 == 0) {
          uVar53 = uVar53 - 1;
        }
        auVar63._8_8_ = 0;
        auVar63._0_8_ = auStack_58[uVar52];
        auStack_3c8[uVar52] = uVar49;
        fVar81 = (float)(iVar16 + 1) * 0.14285715;
        auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * (float)iVar16 * 0.14285715)),
                                   ZEXT416(uVar50),
                                   ZEXT416((uint)(auVar249._0_4_ - (float)iVar16 * 0.14285715)));
        auVar124 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar81)),ZEXT416(uVar50),
                                   ZEXT416((uint)(auVar249._0_4_ - fVar81)));
        fVar81 = auVar124._0_4_;
        fVar82 = auVar101._0_4_;
        fVar57 = fVar81 - fVar82;
        if (0.16666667 <= fVar57) {
          local_328 = vinsertps_avx(auVar101,auVar124,0x10);
          goto LAB_015a7b31;
        }
        auVar121 = vshufps_avx(auVar63,auVar63,0x50);
        auVar92._8_4_ = 0x3f800000;
        auVar92._0_8_ = 0x3f8000003f800000;
        auVar92._12_4_ = 0x3f800000;
        auVar106 = vsubps_avx(auVar92,auVar121);
        fVar115 = auVar121._0_4_;
        auVar130._0_4_ = fVar115 * fVar127;
        fVar80 = auVar121._4_4_;
        auVar130._4_4_ = fVar80 * fVar136;
        fVar56 = auVar121._8_4_;
        auVar130._8_4_ = fVar56 * fVar127;
        fVar83 = auVar121._12_4_;
        auVar130._12_4_ = fVar83 * fVar136;
        auVar143._0_4_ = fVar115 * fVar238;
        auVar143._4_4_ = fVar80 * fVar250;
        auVar143._8_4_ = fVar56 * fVar238;
        auVar143._12_4_ = fVar83 * fVar250;
        auVar165._0_4_ = fVar115 * fVar190;
        auVar165._4_4_ = fVar80 * fVar200;
        auVar165._8_4_ = fVar56 * fVar190;
        auVar165._12_4_ = fVar83 * fVar200;
        auVar65._0_4_ = fVar115 * fVar201;
        auVar65._4_4_ = fVar80 * fVar216;
        auVar65._8_4_ = fVar56 * fVar201;
        auVar65._12_4_ = fVar83 * fVar216;
        auVar121 = vfmadd231ps_fma(auVar130,auVar106,auVar176);
        auVar86 = vfmadd231ps_fma(auVar143,auVar106,auVar221);
        auVar59 = vfmadd231ps_fma(auVar165,auVar106,auVar241);
        auVar106 = vfmadd231ps_fma(auVar65,auVar106,auVar255);
        auVar126._16_16_ = auVar121;
        auVar126._0_16_ = auVar121;
        auVar135._16_16_ = auVar86;
        auVar135._0_16_ = auVar86;
        auVar151._16_16_ = auVar59;
        auVar151._0_16_ = auVar59;
        auVar184._4_4_ = fVar82;
        auVar184._0_4_ = fVar82;
        auVar184._8_4_ = fVar82;
        auVar184._12_4_ = fVar82;
        auVar184._20_4_ = fVar81;
        auVar184._16_4_ = fVar81;
        auVar184._24_4_ = fVar81;
        auVar184._28_4_ = fVar81;
        auVar77 = vsubps_avx(auVar135,auVar126);
        auVar86 = vfmadd213ps_fma(auVar77,auVar184,auVar126);
        auVar77 = vsubps_avx(auVar151,auVar135);
        auVar87 = vfmadd213ps_fma(auVar77,auVar184,auVar135);
        auVar121 = vsubps_avx(auVar106,auVar59);
        auVar79._16_16_ = auVar121;
        auVar79._0_16_ = auVar121;
        auVar121 = vfmadd213ps_fma(auVar79,auVar184,auVar151);
        auVar77 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar86));
        auVar106 = vfmadd213ps_fma(auVar77,auVar184,ZEXT1632(auVar86));
        auVar77 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar87));
        auVar121 = vfmadd213ps_fma(auVar77,auVar184,ZEXT1632(auVar87));
        auVar77 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar106));
        auVar58 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar77,auVar184);
        fVar217 = auVar77._4_4_ * 3.0;
        local_4e8._0_4_ = fVar57;
        fVar115 = fVar57 * 0.33333334;
        auVar177._0_8_ =
             CONCAT44(auVar58._4_4_ + fVar115 * fVar217,
                      auVar58._0_4_ + fVar115 * auVar77._0_4_ * 3.0);
        auVar177._8_4_ = auVar58._8_4_ + fVar115 * auVar77._8_4_ * 3.0;
        auVar177._12_4_ = auVar58._12_4_ + fVar115 * auVar77._12_4_ * 3.0;
        _local_3b8 = vshufpd_avx(auVar58,auVar58,3);
        auVar106 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar121 = vsubps_avx(_local_3b8,auVar58);
        _local_508 = auVar106;
        auVar86 = vsubps_avx(auVar106,(undefined1  [16])0x0);
        auVar66._0_4_ = auVar121._0_4_ + auVar86._0_4_;
        auVar66._4_4_ = auVar121._4_4_ + auVar86._4_4_;
        auVar66._8_4_ = auVar121._8_4_ + auVar86._8_4_;
        auVar66._12_4_ = auVar121._12_4_ + auVar86._12_4_;
        auVar121 = vshufps_avx(auVar58,auVar58,0xb1);
        auVar86 = vshufps_avx(auVar177,auVar177,0xb1);
        auVar267._4_4_ = auVar66._0_4_;
        auVar267._0_4_ = auVar66._0_4_;
        auVar267._8_4_ = auVar66._0_4_;
        auVar267._12_4_ = auVar66._0_4_;
        auVar59 = vshufps_avx(auVar66,auVar66,0x55);
        fVar80 = auVar59._0_4_;
        auVar67._0_4_ = fVar80 * auVar121._0_4_;
        fVar56 = auVar59._4_4_;
        auVar67._4_4_ = fVar56 * auVar121._4_4_;
        fVar83 = auVar59._8_4_;
        auVar67._8_4_ = fVar83 * auVar121._8_4_;
        fVar172 = auVar59._12_4_;
        auVar67._12_4_ = fVar172 * auVar121._12_4_;
        auVar144._0_4_ = fVar80 * auVar86._0_4_;
        auVar144._4_4_ = fVar56 * auVar86._4_4_;
        auVar144._8_4_ = fVar83 * auVar86._8_4_;
        auVar144._12_4_ = fVar172 * auVar86._12_4_;
        auVar87 = vfmadd231ps_fma(auVar67,auVar267,auVar58);
        _local_3f8 = auVar177;
        auVar234 = vfmadd231ps_fma(auVar144,auVar267,auVar177);
        auVar86 = vshufps_avx(auVar87,auVar87,0xe8);
        auVar59 = vshufps_avx(auVar234,auVar234,0xe8);
        auVar121 = vcmpps_avx(auVar86,auVar59,1);
        uVar50 = vextractps_avx(auVar121,0);
        auVar85 = auVar234;
        if ((uVar50 & 1) == 0) {
          auVar85 = auVar87;
        }
        auVar117._0_4_ = fVar115 * auVar77._16_4_ * 3.0;
        auVar117._4_4_ = fVar115 * fVar217;
        auVar117._8_4_ = fVar115 * auVar77._24_4_ * 3.0;
        auVar117._12_4_ = fVar115 * auVar215._28_4_;
        auVar139 = vsubps_avx((undefined1  [16])0x0,auVar117);
        auVar118 = vshufps_avx(auVar139,auVar139,0xb1);
        auVar137 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar178._0_4_ = fVar80 * auVar118._0_4_;
        auVar178._4_4_ = fVar56 * auVar118._4_4_;
        auVar178._8_4_ = fVar83 * auVar118._8_4_;
        auVar178._12_4_ = fVar172 * auVar118._12_4_;
        auVar195._0_4_ = auVar137._0_4_ * fVar80;
        auVar195._4_4_ = auVar137._4_4_ * fVar56;
        auVar195._8_4_ = auVar137._8_4_ * fVar83;
        auVar195._12_4_ = auVar137._12_4_ * fVar172;
        auVar173 = vfmadd231ps_fma(auVar178,auVar267,auVar139);
        auVar191 = vfmadd231ps_fma(auVar195,(undefined1  [16])0x0,auVar267);
        auVar137 = vshufps_avx(auVar173,auVar173,0xe8);
        auVar138 = vshufps_avx(auVar191,auVar191,0xe8);
        auVar215 = ZEXT1664(auVar138);
        auVar118 = vcmpps_avx(auVar137,auVar138,1);
        uVar50 = vextractps_avx(auVar118,0);
        auVar192 = auVar191;
        if ((uVar50 & 1) == 0) {
          auVar192 = auVar173;
        }
        auVar85 = vmaxss_avx(auVar192,auVar85);
        auVar86 = vminps_avx(auVar86,auVar59);
        auVar59 = vminps_avx(auVar137,auVar138);
        auVar59 = vminps_avx(auVar86,auVar59);
        auVar121 = vshufps_avx(auVar121,auVar121,0x55);
        auVar121 = vblendps_avx(auVar121,auVar118,2);
        auVar118 = vpslld_avx(auVar121,0x1f);
        auVar121 = vshufpd_avx(auVar234,auVar234,1);
        auVar121 = vinsertps_avx(auVar121,auVar191,0x9c);
        auVar86 = vshufpd_avx(auVar87,auVar87,1);
        auVar86 = vinsertps_avx(auVar86,auVar173,0x9c);
        auVar121 = vblendvps_avx(auVar86,auVar121,auVar118);
        auVar86 = vmovshdup_avx(auVar121);
        auVar121 = vmaxss_avx(auVar86,auVar121);
        fVar83 = auVar59._0_4_;
        auVar86 = vmovshdup_avx(auVar59);
        auVar249 = ZEXT464(0x3f800000);
        fVar56 = auVar121._0_4_;
        fVar115 = auVar86._0_4_;
        fVar80 = auVar85._0_4_;
        if (((fVar83 < 0.0001) && (-0.0001 < fVar56)) || (fVar115 < 0.0001 && -0.0001 < fVar56)) {
LAB_015a83dd:
          auVar87 = vcmpps_avx(auVar59,_DAT_01f7aa10,1);
          auVar234 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar86 = vcmpss_avx(auVar85,ZEXT816(0) << 0x20,1);
          auVar93._8_4_ = 0x3f800000;
          auVar93._0_8_ = 0x3f8000003f800000;
          auVar93._12_4_ = 0x3f800000;
          auVar109._8_4_ = 0xbf800000;
          auVar109._0_8_ = 0xbf800000bf800000;
          auVar109._12_4_ = 0xbf800000;
          auVar86 = vblendvps_avx(auVar93,auVar109,auVar86);
          auVar87 = vblendvps_avx(auVar93,auVar109,auVar87);
          fVar217 = auVar87._0_4_;
          fVar172 = auVar86._0_4_;
          auVar86 = SUB6416(ZEXT864(0),0);
          if ((fVar217 == fVar172) && (!NAN(fVar217) && !NAN(fVar172))) {
            auVar86 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar217 == fVar172) && (!NAN(fVar217) && !NAN(fVar172))) {
            auVar234 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar87 = vmovshdup_avx(auVar87);
          fVar251 = auVar87._0_4_;
          if ((fVar217 != fVar251) || (NAN(fVar217) || NAN(fVar251))) {
            if ((fVar115 != fVar83) || (NAN(fVar115) || NAN(fVar83))) {
              auVar119._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
              auVar119._8_4_ = auVar59._8_4_ ^ 0x80000000;
              auVar119._12_4_ = auVar59._12_4_ ^ 0x80000000;
              auVar120._0_4_ = -fVar83 / (fVar115 - fVar83);
              auVar120._4_12_ = auVar119._4_12_;
              auVar59 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar120._0_4_)),auVar120,ZEXT416(0));
              auVar87 = auVar59;
            }
            else {
              auVar59 = ZEXT816(0) << 0x20;
              if ((fVar83 != 0.0) || (auVar87 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar83))) {
                auVar59 = SUB6416(ZEXT464(0x7f800000),0);
                auVar87 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar86 = vminss_avx(auVar86,auVar59);
            auVar234 = vmaxss_avx(auVar87,auVar234);
          }
          auVar121 = vcmpss_avx(auVar121,ZEXT416(0),1);
          auVar94._8_4_ = 0x3f800000;
          auVar94._0_8_ = 0x3f8000003f800000;
          auVar94._12_4_ = 0x3f800000;
          auVar110._8_4_ = 0xbf800000;
          auVar110._0_8_ = 0xbf800000bf800000;
          auVar110._12_4_ = 0xbf800000;
          auVar121 = vblendvps_avx(auVar94,auVar110,auVar121);
          fVar115 = auVar121._0_4_;
          if ((fVar172 != fVar115) || (NAN(fVar172) || NAN(fVar115))) {
            if ((fVar56 != fVar80) || (NAN(fVar56) || NAN(fVar80))) {
              auVar68._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar68._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar68._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar122._0_4_ = -fVar80 / (fVar56 - fVar80);
              auVar122._4_12_ = auVar68._4_12_;
              auVar121 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar122._0_4_)),auVar122,ZEXT416(0));
              auVar59 = auVar121;
            }
            else {
              auVar121 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar80 != 0.0) || (auVar59 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar80))) {
                auVar121 = SUB6416(ZEXT464(0xff800000),0);
                auVar59 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar86 = vminss_avx(auVar86,auVar59);
            auVar234 = vmaxss_avx(auVar121,auVar234);
          }
          auVar121 = SUB6416(ZEXT464(0x3f800000),0);
          if ((fVar251 != fVar115) || (NAN(fVar251) || NAN(fVar115))) {
            auVar86 = vminss_avx(auVar86,auVar121);
            auVar234 = vmaxss_avx(auVar121,auVar234);
          }
          auVar86 = vmaxss_avx(ZEXT816(0) << 0x40,auVar86);
          auVar59 = vminss_avx(auVar234,auVar121);
          auVar249 = ZEXT1664(auVar121);
          if (auVar86._0_4_ <= auVar59._0_4_) {
            auVar86 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar86._0_4_ + -0.1)));
            auVar121 = vminss_avx(ZEXT416((uint)(auVar59._0_4_ + 0.1)),auVar121);
            auVar131._0_8_ = auVar58._0_8_;
            auVar131._8_8_ = auVar131._0_8_;
            auVar207._8_8_ = auVar177._0_8_;
            auVar207._0_8_ = auVar177._0_8_;
            auVar222._8_8_ = auVar139._0_8_;
            auVar222._0_8_ = auVar139._0_8_;
            auVar59 = vshufpd_avx(auVar177,auVar177,3);
            auVar87 = vshufpd_avx(auVar139,auVar139,3);
            auVar234 = vshufps_avx(auVar86,auVar121,0);
            auVar69._8_4_ = 0x3f800000;
            auVar69._0_8_ = 0x3f8000003f800000;
            auVar69._12_4_ = 0x3f800000;
            auVar58 = vsubps_avx(auVar69,auVar234);
            fVar115 = auVar234._0_4_;
            auVar70._0_4_ = fVar115 * (float)local_3b8._0_4_;
            fVar80 = auVar234._4_4_;
            auVar70._4_4_ = fVar80 * (float)local_3b8._4_4_;
            fVar56 = auVar234._8_4_;
            auVar70._8_4_ = fVar56 * fStack_3b0;
            fVar83 = auVar234._12_4_;
            auVar70._12_4_ = fVar83 * fStack_3ac;
            auVar166._0_4_ = fVar115 * auVar59._0_4_;
            auVar166._4_4_ = fVar80 * auVar59._4_4_;
            auVar166._8_4_ = fVar56 * auVar59._8_4_;
            auVar166._12_4_ = fVar83 * auVar59._12_4_;
            auVar179._0_4_ = fVar115 * auVar87._0_4_;
            auVar179._4_4_ = fVar80 * auVar87._4_4_;
            auVar179._8_4_ = fVar56 * auVar87._8_4_;
            auVar179._12_4_ = fVar83 * auVar87._12_4_;
            local_508._0_4_ = auVar106._0_4_;
            local_508._4_4_ = auVar106._4_4_;
            fStack_500 = auVar106._8_4_;
            fStack_4fc = auVar106._12_4_;
            auVar196._0_4_ = fVar115 * (float)local_508._0_4_;
            auVar196._4_4_ = fVar80 * (float)local_508._4_4_;
            auVar196._8_4_ = fVar56 * fStack_500;
            auVar196._12_4_ = fVar83 * fStack_4fc;
            auVar87 = vfmadd231ps_fma(auVar70,auVar58,auVar131);
            auVar234 = vfmadd231ps_fma(auVar166,auVar58,auVar207);
            auVar85 = vfmadd231ps_fma(auVar179,auVar58,auVar222);
            auVar58 = vfmadd231ps_fma(auVar196,auVar58,ZEXT816(0));
            auVar106 = vmovshdup_avx(auVar63);
            auVar173 = vfmadd231ss_fma(ZEXT416((uint)(auVar106._0_4_ * auVar86._0_4_)),auVar63,
                                       ZEXT416((uint)(1.0 - auVar86._0_4_)));
            auVar191 = vfmadd231ss_fma(ZEXT416((uint)(auVar106._0_4_ * auVar121._0_4_)),auVar63,
                                       ZEXT416((uint)(1.0 - auVar121._0_4_)));
            fVar115 = 1.0 / fVar57;
            auVar121 = vsubps_avx(auVar234,auVar87);
            auVar208._0_4_ = auVar121._0_4_ * 3.0;
            auVar208._4_4_ = auVar121._4_4_ * 3.0;
            auVar208._8_4_ = auVar121._8_4_ * 3.0;
            auVar208._12_4_ = auVar121._12_4_ * 3.0;
            auVar121 = vsubps_avx(auVar85,auVar234);
            auVar223._0_4_ = auVar121._0_4_ * 3.0;
            auVar223._4_4_ = auVar121._4_4_ * 3.0;
            auVar223._8_4_ = auVar121._8_4_ * 3.0;
            auVar223._12_4_ = auVar121._12_4_ * 3.0;
            auVar121 = vsubps_avx(auVar58,auVar85);
            auVar235._0_4_ = auVar121._0_4_ * 3.0;
            auVar235._4_4_ = auVar121._4_4_ * 3.0;
            auVar235._8_4_ = auVar121._8_4_ * 3.0;
            auVar235._12_4_ = auVar121._12_4_ * 3.0;
            auVar106 = vminps_avx(auVar223,auVar235);
            auVar121 = vmaxps_avx(auVar223,auVar235);
            auVar106 = vminps_avx(auVar208,auVar106);
            auVar121 = vmaxps_avx(auVar208,auVar121);
            auVar86 = vshufpd_avx(auVar106,auVar106,3);
            auVar59 = vshufpd_avx(auVar121,auVar121,3);
            auVar106 = vminps_avx(auVar106,auVar86);
            auVar121 = vmaxps_avx(auVar121,auVar59);
            auVar224._0_4_ = auVar106._0_4_ * fVar115;
            auVar224._4_4_ = auVar106._4_4_ * fVar115;
            auVar224._8_4_ = auVar106._8_4_ * fVar115;
            auVar224._12_4_ = auVar106._12_4_ * fVar115;
            auVar209._0_4_ = auVar121._0_4_ * fVar115;
            auVar209._4_4_ = auVar121._4_4_ * fVar115;
            auVar209._8_4_ = auVar121._8_4_ * fVar115;
            auVar209._12_4_ = auVar121._12_4_ * fVar115;
            fVar115 = 1.0 / (auVar191._0_4_ - auVar173._0_4_);
            auVar121 = vshufpd_avx(auVar87,auVar87,3);
            auVar106 = vshufpd_avx(auVar234,auVar234,3);
            auVar86 = vshufpd_avx(auVar85,auVar85,3);
            auVar59 = vshufpd_avx(auVar58,auVar58,3);
            auVar121 = vsubps_avx(auVar121,auVar87);
            auVar87 = vsubps_avx(auVar106,auVar234);
            auVar234 = vsubps_avx(auVar86,auVar85);
            auVar59 = vsubps_avx(auVar59,auVar58);
            auVar106 = vminps_avx(auVar121,auVar87);
            auVar121 = vmaxps_avx(auVar121,auVar87);
            auVar86 = vminps_avx(auVar234,auVar59);
            auVar86 = vminps_avx(auVar106,auVar86);
            auVar106 = vmaxps_avx(auVar234,auVar59);
            auVar121 = vmaxps_avx(auVar121,auVar106);
            auVar256._0_4_ = fVar115 * auVar86._0_4_;
            auVar256._4_4_ = fVar115 * auVar86._4_4_;
            auVar256._8_4_ = fVar115 * auVar86._8_4_;
            auVar256._12_4_ = fVar115 * auVar86._12_4_;
            auVar242._0_4_ = fVar115 * auVar121._0_4_;
            auVar242._4_4_ = fVar115 * auVar121._4_4_;
            auVar242._8_4_ = fVar115 * auVar121._8_4_;
            auVar242._12_4_ = fVar115 * auVar121._12_4_;
            auVar59 = vinsertps_avx(auVar101,auVar173,0x10);
            auVar87 = vinsertps_avx(auVar124,auVar191,0x10);
            auVar236._0_4_ = (auVar59._0_4_ + auVar87._0_4_) * 0.5;
            auVar236._4_4_ = (auVar59._4_4_ + auVar87._4_4_) * 0.5;
            auVar236._8_4_ = (auVar59._8_4_ + auVar87._8_4_) * 0.5;
            auVar236._12_4_ = (auVar59._12_4_ + auVar87._12_4_) * 0.5;
            auVar71._4_4_ = auVar236._0_4_;
            auVar71._0_4_ = auVar236._0_4_;
            auVar71._8_4_ = auVar236._0_4_;
            auVar71._12_4_ = auVar236._0_4_;
            auVar121 = vfmadd213ps_fma(local_298,auVar71,auVar9);
            auVar106 = vfmadd213ps_fma(local_2a8,auVar71,auVar10);
            auVar86 = vfmadd213ps_fma(local_2b8,auVar71,local_3d8);
            auVar124 = vsubps_avx(auVar106,auVar121);
            auVar121 = vfmadd213ps_fma(auVar124,auVar71,auVar121);
            auVar124 = vsubps_avx(auVar86,auVar106);
            auVar124 = vfmadd213ps_fma(auVar124,auVar71,auVar106);
            auVar124 = vsubps_avx(auVar124,auVar121);
            auVar121 = vfmadd231ps_fma(auVar121,auVar124,auVar71);
            auVar72._0_8_ = CONCAT44(auVar124._4_4_ * 3.0,auVar124._0_4_ * 3.0);
            auVar72._8_4_ = auVar124._8_4_ * 3.0;
            auVar72._12_4_ = auVar124._12_4_ * 3.0;
            auVar268._8_8_ = auVar121._0_8_;
            auVar268._0_8_ = auVar121._0_8_;
            auVar124 = vshufpd_avx(auVar121,auVar121,3);
            auVar121 = vshufps_avx(auVar236,auVar236,0x55);
            auVar58 = vsubps_avx(auVar124,auVar268);
            auVar118 = vfmadd231ps_fma(auVar268,auVar121,auVar58);
            auVar274._8_8_ = auVar72._0_8_;
            auVar274._0_8_ = auVar72._0_8_;
            auVar124 = vshufpd_avx(auVar72,auVar72,3);
            auVar124 = vsubps_avx(auVar124,auVar274);
            auVar85 = vfmadd213ps_fma(auVar124,auVar121,auVar274);
            auVar121 = vmovshdup_avx(auVar85);
            auVar275._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
            auVar275._8_4_ = auVar121._8_4_ ^ 0x80000000;
            auVar275._12_4_ = auVar121._12_4_ ^ 0x80000000;
            auVar106 = vmovshdup_avx(auVar58);
            auVar124 = vunpcklps_avx(auVar106,auVar275);
            auVar86 = vshufps_avx(auVar124,auVar275,4);
            auVar234 = vshufps_avx(auVar236,auVar236,0x54);
            auVar123._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
            auVar123._8_4_ = auVar58._8_4_ ^ 0x80000000;
            auVar123._12_4_ = auVar58._12_4_ ^ 0x80000000;
            auVar124 = vmovlhps_avx(auVar123,auVar85);
            auVar124 = vshufps_avx(auVar124,auVar85,8);
            auVar121 = vfmsub231ss_fma(ZEXT416((uint)(auVar58._0_4_ * auVar121._0_4_)),auVar106,
                                       auVar85);
            uVar55 = auVar121._0_4_;
            auVar73._4_4_ = uVar55;
            auVar73._0_4_ = uVar55;
            auVar73._8_4_ = uVar55;
            auVar73._12_4_ = uVar55;
            auVar121 = vdivps_avx(auVar86,auVar73);
            auVar106 = vdivps_avx(auVar124,auVar73);
            fVar56 = auVar118._0_4_;
            fVar115 = auVar121._0_4_;
            auVar124 = vshufps_avx(auVar118,auVar118,0x55);
            fVar80 = auVar106._0_4_;
            auVar74._0_4_ = fVar56 * fVar115 + auVar124._0_4_ * fVar80;
            auVar74._4_4_ = fVar56 * auVar121._4_4_ + auVar124._4_4_ * auVar106._4_4_;
            auVar74._8_4_ = fVar56 * auVar121._8_4_ + auVar124._8_4_ * auVar106._8_4_;
            auVar74._12_4_ = fVar56 * auVar121._12_4_ + auVar124._12_4_ * auVar106._12_4_;
            auVar139 = vsubps_avx(auVar234,auVar74);
            auVar234 = vmovshdup_avx(auVar121);
            auVar124 = vinsertps_avx(auVar224,auVar256,0x1c);
            auVar145._0_4_ = auVar234._0_4_ * auVar124._0_4_;
            auVar145._4_4_ = auVar234._4_4_ * auVar124._4_4_;
            auVar145._8_4_ = auVar234._8_4_ * auVar124._8_4_;
            auVar145._12_4_ = auVar234._12_4_ * auVar124._12_4_;
            auVar86 = vinsertps_avx(auVar209,auVar242,0x1c);
            auVar95._0_4_ = auVar86._0_4_ * auVar234._0_4_;
            auVar95._4_4_ = auVar86._4_4_ * auVar234._4_4_;
            auVar95._8_4_ = auVar86._8_4_ * auVar234._8_4_;
            auVar95._12_4_ = auVar86._12_4_ * auVar234._12_4_;
            auVar118 = vminps_avx(auVar145,auVar95);
            auVar85 = vmaxps_avx(auVar95,auVar145);
            auVar234 = vinsertps_avx(auVar256,auVar224,0x4c);
            auVar137 = vmovshdup_avx(auVar106);
            auVar58 = vinsertps_avx(auVar242,auVar209,0x4c);
            auVar243._0_4_ = auVar137._0_4_ * auVar234._0_4_;
            auVar243._4_4_ = auVar137._4_4_ * auVar234._4_4_;
            auVar243._8_4_ = auVar137._8_4_ * auVar234._8_4_;
            auVar243._12_4_ = auVar137._12_4_ * auVar234._12_4_;
            auVar225._0_4_ = auVar137._0_4_ * auVar58._0_4_;
            auVar225._4_4_ = auVar137._4_4_ * auVar58._4_4_;
            auVar225._8_4_ = auVar137._8_4_ * auVar58._8_4_;
            auVar225._12_4_ = auVar137._12_4_ * auVar58._12_4_;
            auVar137 = vminps_avx(auVar243,auVar225);
            auVar257._0_4_ = auVar118._0_4_ + auVar137._0_4_;
            auVar257._4_4_ = auVar118._4_4_ + auVar137._4_4_;
            auVar257._8_4_ = auVar118._8_4_ + auVar137._8_4_;
            auVar257._12_4_ = auVar118._12_4_ + auVar137._12_4_;
            auVar118 = vmaxps_avx(auVar225,auVar243);
            auVar96._0_4_ = auVar118._0_4_ + auVar85._0_4_;
            auVar96._4_4_ = auVar118._4_4_ + auVar85._4_4_;
            auVar96._8_4_ = auVar118._8_4_ + auVar85._8_4_;
            auVar96._12_4_ = auVar118._12_4_ + auVar85._12_4_;
            auVar226._8_8_ = 0x3f80000000000000;
            auVar226._0_8_ = 0x3f80000000000000;
            auVar85 = vsubps_avx(auVar226,auVar96);
            auVar118 = vsubps_avx(auVar226,auVar257);
            auVar137 = vsubps_avx(auVar59,auVar236);
            auVar138 = vsubps_avx(auVar87,auVar236);
            auVar111._0_4_ = fVar115 * auVar124._0_4_;
            auVar111._4_4_ = fVar115 * auVar124._4_4_;
            auVar111._8_4_ = fVar115 * auVar124._8_4_;
            auVar111._12_4_ = fVar115 * auVar124._12_4_;
            auVar258._0_4_ = fVar115 * auVar86._0_4_;
            auVar258._4_4_ = fVar115 * auVar86._4_4_;
            auVar258._8_4_ = fVar115 * auVar86._8_4_;
            auVar258._12_4_ = fVar115 * auVar86._12_4_;
            auVar86 = vminps_avx(auVar111,auVar258);
            auVar124 = vmaxps_avx(auVar258,auVar111);
            auVar146._0_4_ = fVar80 * auVar234._0_4_;
            auVar146._4_4_ = fVar80 * auVar234._4_4_;
            auVar146._8_4_ = fVar80 * auVar234._8_4_;
            auVar146._12_4_ = fVar80 * auVar234._12_4_;
            auVar210._0_4_ = fVar80 * auVar58._0_4_;
            auVar210._4_4_ = fVar80 * auVar58._4_4_;
            auVar210._8_4_ = fVar80 * auVar58._8_4_;
            auVar210._12_4_ = fVar80 * auVar58._12_4_;
            auVar234 = vminps_avx(auVar146,auVar210);
            auVar259._0_4_ = auVar86._0_4_ + auVar234._0_4_;
            auVar259._4_4_ = auVar86._4_4_ + auVar234._4_4_;
            auVar259._8_4_ = auVar86._8_4_ + auVar234._8_4_;
            auVar259._12_4_ = auVar86._12_4_ + auVar234._12_4_;
            fVar251 = auVar137._0_4_;
            auVar269._0_4_ = fVar251 * auVar85._0_4_;
            fVar252 = auVar137._4_4_;
            auVar269._4_4_ = fVar252 * auVar85._4_4_;
            fVar185 = auVar137._8_4_;
            auVar269._8_4_ = fVar185 * auVar85._8_4_;
            fVar186 = auVar137._12_4_;
            auVar269._12_4_ = fVar186 * auVar85._12_4_;
            auVar86 = vmaxps_avx(auVar210,auVar146);
            auVar211._0_4_ = fVar251 * auVar118._0_4_;
            auVar211._4_4_ = fVar252 * auVar118._4_4_;
            auVar211._8_4_ = fVar185 * auVar118._8_4_;
            auVar211._12_4_ = fVar186 * auVar118._12_4_;
            fVar56 = auVar138._0_4_;
            auVar97._0_4_ = fVar56 * auVar85._0_4_;
            fVar83 = auVar138._4_4_;
            auVar97._4_4_ = fVar83 * auVar85._4_4_;
            fVar172 = auVar138._8_4_;
            auVar97._8_4_ = fVar172 * auVar85._8_4_;
            fVar217 = auVar138._12_4_;
            auVar97._12_4_ = fVar217 * auVar85._12_4_;
            auVar227._0_4_ = fVar56 * auVar118._0_4_;
            auVar227._4_4_ = fVar83 * auVar118._4_4_;
            auVar227._8_4_ = fVar172 * auVar118._8_4_;
            auVar227._12_4_ = fVar217 * auVar118._12_4_;
            auVar112._0_4_ = auVar124._0_4_ + auVar86._0_4_;
            auVar112._4_4_ = auVar124._4_4_ + auVar86._4_4_;
            auVar112._8_4_ = auVar124._8_4_ + auVar86._8_4_;
            auVar112._12_4_ = auVar124._12_4_ + auVar86._12_4_;
            auVar147._8_8_ = 0x3f800000;
            auVar147._0_8_ = 0x3f800000;
            auVar124 = vsubps_avx(auVar147,auVar112);
            auVar86 = vsubps_avx(auVar147,auVar259);
            auVar260._0_4_ = fVar251 * auVar124._0_4_;
            auVar260._4_4_ = fVar252 * auVar124._4_4_;
            auVar260._8_4_ = fVar185 * auVar124._8_4_;
            auVar260._12_4_ = fVar186 * auVar124._12_4_;
            auVar244._0_4_ = fVar251 * auVar86._0_4_;
            auVar244._4_4_ = fVar252 * auVar86._4_4_;
            auVar244._8_4_ = fVar185 * auVar86._8_4_;
            auVar244._12_4_ = fVar186 * auVar86._12_4_;
            auVar113._0_4_ = fVar56 * auVar124._0_4_;
            auVar113._4_4_ = fVar83 * auVar124._4_4_;
            auVar113._8_4_ = fVar172 * auVar124._8_4_;
            auVar113._12_4_ = fVar217 * auVar124._12_4_;
            auVar148._0_4_ = fVar56 * auVar86._0_4_;
            auVar148._4_4_ = fVar83 * auVar86._4_4_;
            auVar148._8_4_ = fVar172 * auVar86._8_4_;
            auVar148._12_4_ = fVar217 * auVar86._12_4_;
            auVar124 = vminps_avx(auVar260,auVar244);
            auVar86 = vminps_avx(auVar113,auVar148);
            auVar124 = vminps_avx(auVar124,auVar86);
            auVar86 = vmaxps_avx(auVar244,auVar260);
            auVar234 = vmaxps_avx(auVar148,auVar113);
            auVar58 = vminps_avx(auVar269,auVar211);
            auVar85 = vminps_avx(auVar97,auVar227);
            auVar58 = vminps_avx(auVar58,auVar85);
            auVar124 = vhaddps_avx(auVar124,auVar58);
            auVar86 = vmaxps_avx(auVar234,auVar86);
            auVar249 = ZEXT464(0x3f800000);
            auVar234 = vmaxps_avx(auVar211,auVar269);
            auVar58 = vmaxps_avx(auVar227,auVar97);
            auVar234 = vmaxps_avx(auVar58,auVar234);
            auVar86 = vhaddps_avx(auVar86,auVar234);
            auVar124 = vshufps_avx(auVar124,auVar124,0xe8);
            auVar86 = vshufps_avx(auVar86,auVar86,0xe8);
            auVar228._0_4_ = auVar139._0_4_ + auVar124._0_4_;
            auVar228._4_4_ = auVar139._4_4_ + auVar124._4_4_;
            auVar228._8_4_ = auVar139._8_4_ + auVar124._8_4_;
            auVar228._12_4_ = auVar139._12_4_ + auVar124._12_4_;
            auVar212._0_4_ = auVar139._0_4_ + auVar86._0_4_;
            auVar212._4_4_ = auVar139._4_4_ + auVar86._4_4_;
            auVar212._8_4_ = auVar139._8_4_ + auVar86._8_4_;
            auVar212._12_4_ = auVar139._12_4_ + auVar86._12_4_;
            auVar215 = ZEXT1664(auVar212);
            auVar124 = vmaxps_avx(auVar59,auVar228);
            auVar86 = vminps_avx(auVar212,auVar87);
            auVar124 = vcmpps_avx(auVar86,auVar124,1);
            auVar124 = vshufps_avx(auVar124,auVar124,0x50);
            if ((auVar124 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar124[0xf]) {
              bVar48 = 0;
              if ((fVar82 < auVar228._0_4_) && (bVar48 = 0, auVar212._0_4_ < auVar87._0_4_)) {
                auVar86 = vmovshdup_avx(auVar228);
                auVar124 = vcmpps_avx(auVar212,auVar87,1);
                bVar48 = auVar124[4] & auVar173._0_4_ < auVar86._0_4_;
              }
              if (((3 < uVar53 || fVar57 < 0.001) | bVar48) != 1) goto LAB_015a9059;
              lVar47 = 200;
              do {
                fVar56 = auVar139._0_4_;
                fVar82 = 1.0 - fVar56;
                fVar57 = fVar82 * fVar82 * fVar82;
                fVar81 = fVar56 * 3.0 * fVar82 * fVar82;
                fVar82 = fVar82 * fVar56 * fVar56 * 3.0;
                auVar132._4_4_ = fVar57;
                auVar132._0_4_ = fVar57;
                auVar132._8_4_ = fVar57;
                auVar132._12_4_ = fVar57;
                auVar114._4_4_ = fVar81;
                auVar114._0_4_ = fVar81;
                auVar114._8_4_ = fVar81;
                auVar114._12_4_ = fVar81;
                auVar98._4_4_ = fVar82;
                auVar98._0_4_ = fVar82;
                auVar98._8_4_ = fVar82;
                auVar98._12_4_ = fVar82;
                fVar56 = fVar56 * fVar56 * fVar56;
                auVar149._0_4_ = fVar56 * (float)local_278._0_4_;
                auVar149._4_4_ = fVar56 * (float)local_278._4_4_;
                auVar149._8_4_ = fVar56 * fStack_270;
                auVar149._12_4_ = fVar56 * fStack_26c;
                auVar101 = vfmadd231ps_fma(auVar149,auVar98,local_3d8);
                auVar101 = vfmadd231ps_fma(auVar101,auVar114,auVar10);
                auVar101 = vfmadd231ps_fma(auVar101,auVar132,auVar9);
                auVar99._8_8_ = auVar101._0_8_;
                auVar99._0_8_ = auVar101._0_8_;
                auVar101 = vshufpd_avx(auVar101,auVar101,3);
                auVar124 = vshufps_avx(auVar139,auVar139,0x55);
                auVar101 = vsubps_avx(auVar101,auVar99);
                auVar124 = vfmadd213ps_fma(auVar101,auVar124,auVar99);
                fVar57 = auVar124._0_4_;
                auVar101 = vshufps_avx(auVar124,auVar124,0x55);
                auVar100._0_4_ = fVar115 * fVar57 + fVar80 * auVar101._0_4_;
                auVar100._4_4_ = auVar121._4_4_ * fVar57 + auVar106._4_4_ * auVar101._4_4_;
                auVar100._8_4_ = auVar121._8_4_ * fVar57 + auVar106._8_4_ * auVar101._8_4_;
                auVar100._12_4_ = auVar121._12_4_ * fVar57 + auVar106._12_4_ * auVar101._12_4_;
                auVar139 = vsubps_avx(auVar139,auVar100);
                auVar101 = vandps_avx(local_408,auVar124);
                auVar124 = vshufps_avx(auVar101,auVar101,0xf5);
                auVar101 = vmaxss_avx(auVar124,auVar101);
                if (auVar101._0_4_ < (float)local_288._0_4_) {
                  fVar57 = auVar139._0_4_;
                  if ((0.0 <= fVar57) && (fVar57 <= 1.0)) {
                    auVar101 = vmovshdup_avx(auVar139);
                    fVar81 = auVar101._0_4_;
                    if ((0.0 <= fVar81) && (fVar81 <= 1.0)) {
                      auVar101 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                               0x1c);
                      auVar234 = vinsertps_avx(auVar101,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                      auVar101 = vdpps_avx(auVar234,local_418,0x7f);
                      auVar124 = vdpps_avx(auVar234,local_428,0x7f);
                      auVar121 = vdpps_avx(auVar234,local_2c8,0x7f);
                      auVar106 = vdpps_avx(auVar234,local_2d8,0x7f);
                      auVar86 = vdpps_avx(auVar234,local_2e8,0x7f);
                      auVar59 = vdpps_avx(auVar234,local_2f8,0x7f);
                      auVar87 = vdpps_avx(auVar234,local_308,0x7f);
                      auVar234 = vdpps_avx(auVar234,local_318,0x7f);
                      fVar82 = 1.0 - fVar81;
                      auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar81 * auVar86._0_4_)),
                                                 ZEXT416((uint)fVar82),auVar101);
                      auVar124 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar81)),
                                                 ZEXT416((uint)fVar82),auVar124);
                      auVar121 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ * fVar81)),
                                                 ZEXT416((uint)fVar82),auVar121);
                      auVar215 = ZEXT1664(auVar121);
                      auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar81 * auVar234._0_4_)),
                                                 ZEXT416((uint)fVar82),auVar106);
                      fVar56 = 1.0 - fVar57;
                      fVar82 = fVar56 * fVar57 * fVar57 * 3.0;
                      fVar172 = fVar57 * fVar57 * fVar57;
                      auVar121 = vfmadd231ss_fma(ZEXT416((uint)(fVar172 * auVar106._0_4_)),
                                                 ZEXT416((uint)fVar82),auVar121);
                      fVar115 = fVar57 * 3.0 * fVar56 * fVar56;
                      auVar124 = vfmadd231ss_fma(auVar121,ZEXT416((uint)fVar115),auVar124);
                      fVar80 = fVar56 * fVar56 * fVar56;
                      auVar101 = vfmadd231ss_fma(auVar124,ZEXT416((uint)fVar80),auVar101);
                      fVar83 = auVar101._0_4_;
                      if (((fVar54 <= fVar83) &&
                          (fVar217 = *(float *)(ray + k * 4 + 0x80), fVar83 <= fVar217)) &&
                         (pGVar4 = (context->scene->geometries).items[uVar45].ptr,
                         (pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                        auVar101 = vshufps_avx(auVar139,auVar139,0x55);
                        auVar213._8_4_ = 0x3f800000;
                        auVar213._0_8_ = 0x3f8000003f800000;
                        auVar213._12_4_ = 0x3f800000;
                        auVar124 = vsubps_avx(auVar213,auVar101);
                        fVar251 = auVar101._0_4_;
                        auVar229._0_4_ = fVar251 * (float)local_448._0_4_;
                        fVar252 = auVar101._4_4_;
                        auVar229._4_4_ = fVar252 * (float)local_448._4_4_;
                        fVar185 = auVar101._8_4_;
                        auVar229._8_4_ = fVar185 * fStack_440;
                        fVar186 = auVar101._12_4_;
                        auVar229._12_4_ = fVar186 * fStack_43c;
                        auVar237._0_4_ = fVar251 * (float)local_488._0_4_;
                        auVar237._4_4_ = fVar252 * (float)local_488._4_4_;
                        auVar237._8_4_ = fVar185 * fStack_480;
                        auVar237._12_4_ = fVar186 * fStack_47c;
                        auVar245._0_4_ = fVar251 * (float)local_498._0_4_;
                        auVar245._4_4_ = fVar252 * (float)local_498._4_4_;
                        auVar245._8_4_ = fVar185 * fStack_490;
                        auVar245._12_4_ = fVar186 * fStack_48c;
                        auVar261._0_4_ = fVar251 * fVar152;
                        auVar261._4_4_ = fVar252 * fVar169;
                        auVar261._8_4_ = fVar185 * fVar170;
                        auVar261._12_4_ = fVar186 * fVar171;
                        auVar121 = vfmadd231ps_fma(auVar229,auVar124,local_438);
                        auVar106 = vfmadd231ps_fma(auVar237,auVar124,local_468);
                        auVar86 = vfmadd231ps_fma(auVar245,auVar124,local_478);
                        auVar59 = vfmadd231ps_fma(auVar261,auVar124,local_458);
                        auVar124 = vsubps_avx(auVar106,auVar121);
                        auVar121 = vsubps_avx(auVar86,auVar106);
                        auVar106 = vsubps_avx(auVar59,auVar86);
                        local_218._4_4_ = fVar57;
                        local_218._0_4_ = fVar57;
                        local_218._8_4_ = fVar57;
                        local_218._12_4_ = fVar57;
                        auVar215 = ZEXT1664(local_218);
                        auVar262._0_4_ = fVar57 * auVar121._0_4_;
                        auVar262._4_4_ = fVar57 * auVar121._4_4_;
                        auVar262._8_4_ = fVar57 * auVar121._8_4_;
                        auVar262._12_4_ = fVar57 * auVar121._12_4_;
                        auVar197._4_4_ = fVar56;
                        auVar197._0_4_ = fVar56;
                        auVar197._8_4_ = fVar56;
                        auVar197._12_4_ = fVar56;
                        auVar124 = vfmadd231ps_fma(auVar262,auVar197,auVar124);
                        auVar230._0_4_ = fVar57 * auVar106._0_4_;
                        auVar230._4_4_ = fVar57 * auVar106._4_4_;
                        auVar230._8_4_ = fVar57 * auVar106._8_4_;
                        auVar230._12_4_ = fVar57 * auVar106._12_4_;
                        auVar121 = vfmadd231ps_fma(auVar230,auVar197,auVar121);
                        auVar231._0_4_ = fVar57 * auVar121._0_4_;
                        auVar231._4_4_ = fVar57 * auVar121._4_4_;
                        auVar231._8_4_ = fVar57 * auVar121._8_4_;
                        auVar231._12_4_ = fVar57 * auVar121._12_4_;
                        auVar121 = vfmadd231ps_fma(auVar231,auVar197,auVar124);
                        auVar180._0_4_ = fVar172 * (float)local_368._0_4_;
                        auVar180._4_4_ = fVar172 * (float)local_368._4_4_;
                        auVar180._8_4_ = fVar172 * fStack_360;
                        auVar180._12_4_ = fVar172 * fStack_35c;
                        auVar133._4_4_ = fVar82;
                        auVar133._0_4_ = fVar82;
                        auVar133._8_4_ = fVar82;
                        auVar133._12_4_ = fVar82;
                        auVar124 = vfmadd132ps_fma(auVar133,auVar180,local_358);
                        auVar167._4_4_ = fVar115;
                        auVar167._0_4_ = fVar115;
                        auVar167._8_4_ = fVar115;
                        auVar167._12_4_ = fVar115;
                        auVar124 = vfmadd132ps_fma(auVar167,auVar124,local_348);
                        auVar181._0_4_ = auVar121._0_4_ * 3.0;
                        auVar181._4_4_ = auVar121._4_4_ * 3.0;
                        auVar181._8_4_ = auVar121._8_4_ * 3.0;
                        auVar181._12_4_ = auVar121._12_4_ * 3.0;
                        auVar150._4_4_ = fVar80;
                        auVar150._0_4_ = fVar80;
                        auVar150._8_4_ = fVar80;
                        auVar150._12_4_ = fVar80;
                        auVar121 = vfmadd132ps_fma(auVar150,auVar124,local_338);
                        auVar124 = vshufps_avx(auVar181,auVar181,0xc9);
                        auVar134._0_4_ = auVar121._0_4_ * auVar124._0_4_;
                        auVar134._4_4_ = auVar121._4_4_ * auVar124._4_4_;
                        auVar134._8_4_ = auVar121._8_4_ * auVar124._8_4_;
                        auVar134._12_4_ = auVar121._12_4_ * auVar124._12_4_;
                        auVar124 = vshufps_avx(auVar121,auVar121,0xc9);
                        auVar124 = vfmsub231ps_fma(auVar134,auVar181,auVar124);
                        local_228 = auVar124._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar83;
                          uVar55 = vextractps_avx(auVar124,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar55;
                          uVar55 = vextractps_avx(auVar124,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar55;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
                          *(float *)(ray + k * 4 + 0xf0) = fVar57;
                          *(float *)(ray + k * 4 + 0x100) = fVar81;
                          *(uint *)(ray + k * 4 + 0x110) = uVar3;
                          *(uint *)(ray + k * 4 + 0x120) = uVar45;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          auVar249 = ZEXT464(0x3f800000);
                        }
                        else {
                          auVar121 = vshufps_avx(auVar124,auVar124,0x55);
                          auVar124 = vshufps_avx(auVar124,auVar124,0xaa);
                          local_248[0] = (RTCHitN)auVar121[0];
                          local_248[1] = (RTCHitN)auVar121[1];
                          local_248[2] = (RTCHitN)auVar121[2];
                          local_248[3] = (RTCHitN)auVar121[3];
                          local_248[4] = (RTCHitN)auVar121[4];
                          local_248[5] = (RTCHitN)auVar121[5];
                          local_248[6] = (RTCHitN)auVar121[6];
                          local_248[7] = (RTCHitN)auVar121[7];
                          local_248[8] = (RTCHitN)auVar121[8];
                          local_248[9] = (RTCHitN)auVar121[9];
                          local_248[10] = (RTCHitN)auVar121[10];
                          local_248[0xb] = (RTCHitN)auVar121[0xb];
                          local_248[0xc] = (RTCHitN)auVar121[0xc];
                          local_248[0xd] = (RTCHitN)auVar121[0xd];
                          local_248[0xe] = (RTCHitN)auVar121[0xe];
                          local_248[0xf] = (RTCHitN)auVar121[0xf];
                          local_238 = auVar124;
                          uStack_224 = local_228;
                          uStack_220 = local_228;
                          uStack_21c = local_228;
                          local_208 = auVar101;
                          local_1f8 = CONCAT44(uStack_394,local_398);
                          uStack_1f0 = CONCAT44(uStack_38c,uStack_390);
                          local_1e8._4_4_ = uStack_384;
                          local_1e8._0_4_ = local_388;
                          local_1e8._8_4_ = uStack_380;
                          local_1e8._12_4_ = uStack_37c;
                          vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                          uStack_1d4 = context->user->instID[0];
                          local_1d8 = uStack_1d4;
                          uStack_1d0 = uStack_1d4;
                          uStack_1cc = uStack_1d4;
                          uStack_1c8 = context->user->instPrimID[0];
                          uStack_1c4 = uStack_1c8;
                          uStack_1c0 = uStack_1c8;
                          uStack_1bc = uStack_1c8;
                          *(float *)(ray + k * 4 + 0x80) = fVar83;
                          local_528 = *local_510;
                          local_4c8.valid = (int *)local_528;
                          local_4c8.geometryUserPtr = pGVar4->userPtr;
                          local_4c8.context = context->user;
                          local_4c8.hit = local_248;
                          local_4c8.N = 4;
                          local_4c8.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar215 = ZEXT1664(local_218);
                            (*pGVar4->intersectionFilterN)(&local_4c8);
                            auVar249._8_56_ = extraout_var;
                            auVar249._0_8_ = extraout_XMM1_Qa;
                            auVar124 = auVar249._0_16_;
                          }
                          if (local_528 == (undefined1  [16])0x0) {
                            auVar101 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar124 = vpcmpeqd_avx(auVar124,auVar124);
                            auVar101 = auVar101 ^ auVar124;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            auVar124 = vpcmpeqd_avx(auVar101,auVar101);
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar215 = ZEXT1664(auVar215._0_16_);
                              (*p_Var5)(&local_4c8);
                              auVar124 = vpcmpeqd_avx(auVar124,auVar124);
                            }
                            auVar121 = vpcmpeqd_avx(local_528,_DAT_01f7aa10);
                            auVar101 = auVar121 ^ auVar124;
                            if (local_528 != (undefined1  [16])0x0) {
                              auVar121 = auVar121 ^ auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])local_4c8.hit
                                                       );
                              *(undefined1 (*) [16])(local_4c8.ray + 0xc0) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x10));
                              *(undefined1 (*) [16])(local_4c8.ray + 0xd0) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x20));
                              *(undefined1 (*) [16])(local_4c8.ray + 0xe0) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x30));
                              *(undefined1 (*) [16])(local_4c8.ray + 0xf0) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x40));
                              *(undefined1 (*) [16])(local_4c8.ray + 0x100) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x50));
                              *(undefined1 (*) [16])(local_4c8.ray + 0x110) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x60));
                              *(undefined1 (*) [16])(local_4c8.ray + 0x120) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x70));
                              *(undefined1 (*) [16])(local_4c8.ray + 0x130) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x80));
                              *(undefined1 (*) [16])(local_4c8.ray + 0x140) = auVar124;
                            }
                          }
                          auVar249 = ZEXT464(0x3f800000);
                          auVar75._8_8_ = 0x100000001;
                          auVar75._0_8_ = 0x100000001;
                          if ((auVar75 & auVar101) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar217;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar47 = lVar47 + -1;
              } while (lVar47 != 0);
            }
          }
        }
        else {
          auVar86 = vcmpps_avx(auVar86,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar87 = vcmpps_avx(auVar59,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar86 = vandps_avx(auVar87,auVar86);
          if (-0.0001 < fVar80 && (auVar86 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_015a83dd;
        }
        if (uVar53 == 0) break;
      } while( true );
    }
    uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar76._4_4_ = uVar55;
    auVar76._0_4_ = uVar55;
    auVar76._8_4_ = uVar55;
    auVar76._12_4_ = uVar55;
    auVar101 = vcmpps_avx(local_378,auVar76,2);
    uVar45 = vmovmskps_avx(auVar101);
    uVar45 = (uint)uVar51 & uVar45;
    if (uVar45 == 0) {
      return;
    }
  } while( true );
LAB_015a9059:
  local_328 = vinsertps_avx(auVar101,ZEXT416((uint)fVar81),0x10);
  auVar63 = vinsertps_avx(auVar173,ZEXT416((uint)auVar191._0_4_),0x10);
  goto LAB_015a7b31;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }